

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

bool embree::avx512::CurveNiIntersectorK<8,4>::
     occluded_t<embree::avx512::RibbonCurve1IntersectorK<embree::BezierCurveT,4,8>,embree::avx512::Occluded1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  undefined1 (*pauVar4) [16];
  undefined1 (*pauVar5) [16];
  undefined1 (*pauVar6) [12];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  int iVar13;
  Geometry *pGVar14;
  RTCFilterFunctionN p_Var15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined8 uVar24;
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  byte bVar72;
  Geometry *geometry;
  long lVar73;
  ulong uVar74;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  float fVar82;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  ulong uVar75;
  bool bVar76;
  ulong uVar77;
  undefined8 unaff_R13;
  long lVar78;
  byte bVar79;
  ulong uVar80;
  float fVar81;
  float fVar130;
  float fVar131;
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar87 [16];
  float fVar132;
  float fVar134;
  float fVar135;
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  float fVar133;
  float fVar136;
  float fVar137;
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  float fVar138;
  undefined4 uVar139;
  float fVar144;
  float fVar145;
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined8 uVar146;
  undefined1 auVar147 [32];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [32];
  float fVar151;
  float fVar152;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 in_ZMM4 [64];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [32];
  float fVar166;
  float fVar167;
  undefined1 auVar168 [16];
  undefined1 auVar169 [32];
  undefined1 auVar170 [64];
  undefined1 auVar171 [16];
  undefined1 auVar172 [32];
  uint uVar173;
  undefined1 auVar174 [16];
  undefined1 auVar175 [32];
  undefined1 auVar176 [16];
  undefined1 auVar177 [32];
  undefined1 auVar178 [16];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [64];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [64];
  undefined1 auVar186 [64];
  undefined1 auVar187 [64];
  undefined1 auVar188 [64];
  undefined1 auVar189 [64];
  undefined1 auVar190 [64];
  undefined1 auVar191 [64];
  undefined1 auVar192 [64];
  undefined1 auVar193 [64];
  undefined1 auVar194 [64];
  RTCFilterFunctionNArguments args;
  undefined1 local_5e0 [16];
  ulong local_5c8;
  undefined1 local_5c0 [16];
  undefined8 local_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined1 local_590 [16];
  Geometry *local_580;
  Precalculations *local_578;
  RTCFilterFunctionNArguments local_570;
  undefined1 local_540 [32];
  undefined1 local_510 [16];
  undefined1 local_500 [16];
  float local_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  LinearSpace3fa *local_450;
  ulong local_448;
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [16];
  undefined1 local_390 [16];
  float local_380;
  float fStack_37c;
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  float fStack_364;
  uint local_360;
  uint uStack_35c;
  uint uStack_358;
  uint uStack_354;
  uint uStack_350;
  uint uStack_34c;
  uint uStack_348;
  uint uStack_344;
  undefined4 local_330;
  undefined4 uStack_32c;
  undefined4 uStack_328;
  undefined4 uStack_324;
  undefined1 local_320 [16];
  undefined1 local_310 [16];
  float local_300;
  float fStack_2fc;
  float fStack_2f8;
  float fStack_2f4;
  undefined4 local_2f0;
  undefined4 uStack_2ec;
  undefined4 uStack_2e8;
  undefined4 uStack_2e4;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined1 local_2d0 [16];
  uint local_2c0;
  uint uStack_2bc;
  uint uStack_2b8;
  uint uStack_2b4;
  uint uStack_2b0;
  uint uStack_2ac;
  uint uStack_2a8;
  uint uStack_2a4;
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined4 local_220;
  int local_21c;
  undefined1 local_210 [16];
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [8];
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  undefined4 uStack_e4;
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar90 [16];
  
  uVar77 = (ulong)(byte)prim[1];
  fVar152 = *(float *)(prim + uVar77 * 0x19 + 0x12);
  auVar85 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar85 = vinsertps_avx(auVar85,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar84 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar22 = vinsertps_avx(auVar84,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar23 = vsubps_avx(auVar85,*(undefined1 (*) [16])(prim + uVar77 * 0x19 + 6));
  fVar151 = fVar152 * auVar23._0_4_;
  auVar85._8_8_ = 0;
  auVar85._0_8_ = *(ulong *)(prim + uVar77 * 4 + 6);
  auVar97 = vpmovsxbd_avx2(auVar85);
  fVar138 = fVar152 * auVar22._0_4_;
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar84._8_8_ = 0;
  auVar84._0_8_ = *(ulong *)(prim + uVar77 * 5 + 6);
  auVar94 = vpmovsxbd_avx2(auVar84);
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar89._8_8_ = 0;
  auVar89._0_8_ = *(ulong *)(prim + uVar77 * 6 + 6);
  auVar95 = vpmovsxbd_avx2(auVar89);
  auVar83._8_8_ = 0;
  auVar83._0_8_ = *(ulong *)(prim + uVar77 * 0xb + 6);
  auVar96 = vpmovsxbd_avx2(auVar83);
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar77 * 0xc + 6);
  auVar99 = vpmovsxbd_avx2(auVar9);
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar77 * 0xd + 6);
  auVar98 = vpmovsxbd_avx2(auVar10);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar77 * 0x12 + 6);
  auVar108 = vpmovsxbd_avx2(auVar11);
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar108 = vcvtdq2ps_avx(auVar108);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar77 * 0x13 + 6);
  auVar107 = vpmovsxbd_avx2(auVar12);
  auVar107 = vcvtdq2ps_avx(auVar107);
  auVar86._8_8_ = 0;
  auVar86._0_8_ = *(ulong *)(prim + uVar77 * 0x14 + 6);
  auVar101 = vpmovsxbd_avx2(auVar86);
  auVar100 = vcvtdq2ps_avx(auVar101);
  auVar182._8_4_ = 1;
  auVar182._0_8_ = 0x100000001;
  auVar182._12_4_ = 1;
  auVar182._16_4_ = 1;
  auVar182._20_4_ = 1;
  auVar182._24_4_ = 1;
  auVar182._28_4_ = 1;
  auVar179._4_4_ = fVar138;
  auVar179._0_4_ = fVar138;
  auVar179._8_4_ = fVar138;
  auVar179._12_4_ = fVar138;
  auVar179._16_4_ = fVar138;
  auVar179._20_4_ = fVar138;
  auVar179._24_4_ = fVar138;
  auVar179._28_4_ = fVar138;
  auVar93 = ZEXT1632(CONCAT412(fVar152 * auVar22._12_4_,
                               CONCAT48(fVar152 * auVar22._8_4_,
                                        CONCAT44(fVar152 * auVar22._4_4_,fVar138))));
  auVar102 = vpermps_avx2(auVar182,auVar93);
  auVar91 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar92 = vpermps_avx512vl(auVar91,auVar93);
  fVar138 = auVar92._0_4_;
  auVar191._0_4_ = fVar138 * auVar95._0_4_;
  fVar144 = auVar92._4_4_;
  auVar191._4_4_ = fVar144 * auVar95._4_4_;
  fVar145 = auVar92._8_4_;
  auVar191._8_4_ = fVar145 * auVar95._8_4_;
  fVar166 = auVar92._12_4_;
  auVar191._12_4_ = fVar166 * auVar95._12_4_;
  fVar167 = auVar92._16_4_;
  auVar191._16_4_ = fVar167 * auVar95._16_4_;
  fVar81 = auVar92._20_4_;
  auVar191._20_4_ = fVar81 * auVar95._20_4_;
  fVar82 = auVar92._24_4_;
  auVar191._28_36_ = in_ZMM4._28_36_;
  auVar191._24_4_ = fVar82 * auVar95._24_4_;
  auVar93._4_4_ = auVar98._4_4_ * fVar144;
  auVar93._0_4_ = auVar98._0_4_ * fVar138;
  auVar93._8_4_ = auVar98._8_4_ * fVar145;
  auVar93._12_4_ = auVar98._12_4_ * fVar166;
  auVar93._16_4_ = auVar98._16_4_ * fVar167;
  auVar93._20_4_ = auVar98._20_4_ * fVar81;
  auVar93._24_4_ = auVar98._24_4_ * fVar82;
  auVar93._28_4_ = auVar101._28_4_;
  auVar101._4_4_ = fVar144 * auVar100._4_4_;
  auVar101._0_4_ = fVar138 * auVar100._0_4_;
  auVar101._8_4_ = fVar145 * auVar100._8_4_;
  auVar101._12_4_ = fVar166 * auVar100._12_4_;
  auVar101._16_4_ = fVar167 * auVar100._16_4_;
  auVar101._20_4_ = fVar81 * auVar100._20_4_;
  auVar101._24_4_ = fVar82 * auVar100._24_4_;
  auVar101._28_4_ = auVar92._28_4_;
  auVar85 = vfmadd231ps_fma(auVar191._0_32_,auVar102,auVar94);
  auVar84 = vfmadd231ps_fma(auVar93,auVar102,auVar99);
  auVar89 = vfmadd231ps_fma(auVar101,auVar107,auVar102);
  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar179,auVar97);
  auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),auVar179,auVar96);
  auVar89 = vfmadd231ps_fma(ZEXT1632(auVar89),auVar108,auVar179);
  auVar180._4_4_ = fVar151;
  auVar180._0_4_ = fVar151;
  auVar180._8_4_ = fVar151;
  auVar180._12_4_ = fVar151;
  auVar180._16_4_ = fVar151;
  auVar180._20_4_ = fVar151;
  auVar180._24_4_ = fVar151;
  auVar180._28_4_ = fVar151;
  auVar102 = ZEXT1632(CONCAT412(fVar152 * auVar23._12_4_,
                                CONCAT48(fVar152 * auVar23._8_4_,
                                         CONCAT44(fVar152 * auVar23._4_4_,fVar151))));
  auVar101 = vpermps_avx2(auVar182,auVar102);
  auVar93 = vpermps_avx512vl(auVar91,auVar102);
  fVar152 = auVar93._0_4_;
  fVar138 = auVar93._4_4_;
  auVar102._4_4_ = fVar138 * auVar95._4_4_;
  auVar102._0_4_ = fVar152 * auVar95._0_4_;
  fVar144 = auVar93._8_4_;
  auVar102._8_4_ = fVar144 * auVar95._8_4_;
  fVar145 = auVar93._12_4_;
  auVar102._12_4_ = fVar145 * auVar95._12_4_;
  fVar166 = auVar93._16_4_;
  auVar102._16_4_ = fVar166 * auVar95._16_4_;
  fVar167 = auVar93._20_4_;
  auVar102._20_4_ = fVar167 * auVar95._20_4_;
  fVar81 = auVar93._24_4_;
  auVar102._24_4_ = fVar81 * auVar95._24_4_;
  auVar102._28_4_ = auVar95._28_4_;
  auVar105._0_4_ = fVar152 * auVar98._0_4_;
  auVar105._4_4_ = fVar138 * auVar98._4_4_;
  auVar105._8_4_ = fVar144 * auVar98._8_4_;
  auVar105._12_4_ = fVar145 * auVar98._12_4_;
  auVar105._16_4_ = fVar166 * auVar98._16_4_;
  auVar105._20_4_ = fVar167 * auVar98._20_4_;
  auVar105._24_4_ = fVar81 * auVar98._24_4_;
  auVar105._28_4_ = 0;
  auVar98._4_4_ = fVar138 * auVar100._4_4_;
  auVar98._0_4_ = fVar152 * auVar100._0_4_;
  auVar98._8_4_ = fVar144 * auVar100._8_4_;
  auVar98._12_4_ = fVar145 * auVar100._12_4_;
  auVar98._16_4_ = fVar166 * auVar100._16_4_;
  auVar98._20_4_ = fVar167 * auVar100._20_4_;
  auVar98._24_4_ = fVar81 * auVar100._24_4_;
  auVar98._28_4_ = auVar100._28_4_;
  auVar83 = vfmadd231ps_fma(auVar102,auVar101,auVar94);
  auVar9 = vfmadd231ps_fma(auVar105,auVar101,auVar99);
  auVar10 = vfmadd231ps_fma(auVar98,auVar101,auVar107);
  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar180,auVar97);
  auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar180,auVar96);
  auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar180,auVar108);
  auVar172._8_4_ = 0x7fffffff;
  auVar172._0_8_ = 0x7fffffff7fffffff;
  auVar172._12_4_ = 0x7fffffff;
  auVar172._16_4_ = 0x7fffffff;
  auVar172._20_4_ = 0x7fffffff;
  auVar172._24_4_ = 0x7fffffff;
  auVar172._28_4_ = 0x7fffffff;
  auVar165._8_4_ = 0x219392ef;
  auVar165._0_8_ = 0x219392ef219392ef;
  auVar165._12_4_ = 0x219392ef;
  auVar165._16_4_ = 0x219392ef;
  auVar165._20_4_ = 0x219392ef;
  auVar165._24_4_ = 0x219392ef;
  auVar165._28_4_ = 0x219392ef;
  auVar97 = vandps_avx(auVar172,ZEXT1632(auVar85));
  uVar80 = vcmpps_avx512vl(auVar97,auVar165,1);
  bVar76 = (bool)((byte)uVar80 & 1);
  auVar91._0_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar85._0_4_;
  bVar76 = (bool)((byte)(uVar80 >> 1) & 1);
  auVar91._4_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar85._4_4_;
  bVar76 = (bool)((byte)(uVar80 >> 2) & 1);
  auVar91._8_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar85._8_4_;
  bVar76 = (bool)((byte)(uVar80 >> 3) & 1);
  auVar91._12_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar85._12_4_;
  auVar91._16_4_ = (uint)((byte)(uVar80 >> 4) & 1) * 0x219392ef;
  auVar91._20_4_ = (uint)((byte)(uVar80 >> 5) & 1) * 0x219392ef;
  auVar91._24_4_ = (uint)((byte)(uVar80 >> 6) & 1) * 0x219392ef;
  auVar91._28_4_ = (uint)(byte)(uVar80 >> 7) * 0x219392ef;
  auVar97 = vandps_avx(auVar172,ZEXT1632(auVar84));
  uVar80 = vcmpps_avx512vl(auVar97,auVar165,1);
  bVar76 = (bool)((byte)uVar80 & 1);
  auVar92._0_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar84._0_4_;
  bVar76 = (bool)((byte)(uVar80 >> 1) & 1);
  auVar92._4_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar84._4_4_;
  bVar76 = (bool)((byte)(uVar80 >> 2) & 1);
  auVar92._8_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar84._8_4_;
  bVar76 = (bool)((byte)(uVar80 >> 3) & 1);
  auVar92._12_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar84._12_4_;
  auVar92._16_4_ = (uint)((byte)(uVar80 >> 4) & 1) * 0x219392ef;
  auVar92._20_4_ = (uint)((byte)(uVar80 >> 5) & 1) * 0x219392ef;
  auVar92._24_4_ = (uint)((byte)(uVar80 >> 6) & 1) * 0x219392ef;
  auVar92._28_4_ = (uint)(byte)(uVar80 >> 7) * 0x219392ef;
  auVar97 = vandps_avx(auVar172,ZEXT1632(auVar89));
  uVar80 = vcmpps_avx512vl(auVar97,auVar165,1);
  bVar76 = (bool)((byte)uVar80 & 1);
  auVar97._0_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar89._0_4_;
  bVar76 = (bool)((byte)(uVar80 >> 1) & 1);
  auVar97._4_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar89._4_4_;
  bVar76 = (bool)((byte)(uVar80 >> 2) & 1);
  auVar97._8_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar89._8_4_;
  bVar76 = (bool)((byte)(uVar80 >> 3) & 1);
  auVar97._12_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar89._12_4_;
  auVar97._16_4_ = (uint)((byte)(uVar80 >> 4) & 1) * 0x219392ef;
  auVar97._20_4_ = (uint)((byte)(uVar80 >> 5) & 1) * 0x219392ef;
  auVar97._24_4_ = (uint)((byte)(uVar80 >> 6) & 1) * 0x219392ef;
  auVar97._28_4_ = (uint)(byte)(uVar80 >> 7) * 0x219392ef;
  auVar94 = vrcp14ps_avx512vl(auVar91);
  auVar95 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar96 = vfnmadd213ps_avx512vl(auVar91,auVar94,auVar95);
  auVar85 = vfmadd132ps_fma(auVar96,auVar94,auVar94);
  auVar94 = vrcp14ps_avx512vl(auVar92);
  auVar96 = vfnmadd213ps_avx512vl(auVar92,auVar94,auVar95);
  auVar84 = vfmadd132ps_fma(auVar96,auVar94,auVar94);
  auVar94 = vrcp14ps_avx512vl(auVar97);
  auVar97 = vfnmadd213ps_avx512vl(auVar97,auVar94,auVar95);
  auVar89 = vfmadd132ps_fma(auVar97,auVar94,auVar94);
  auVar97 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar77 * 7 + 6));
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar97 = vsubps_avx(auVar97,ZEXT1632(auVar83));
  auVar108._4_4_ = auVar85._4_4_ * auVar97._4_4_;
  auVar108._0_4_ = auVar85._0_4_ * auVar97._0_4_;
  auVar108._8_4_ = auVar85._8_4_ * auVar97._8_4_;
  auVar108._12_4_ = auVar85._12_4_ * auVar97._12_4_;
  auVar108._16_4_ = auVar97._16_4_ * 0.0;
  auVar108._20_4_ = auVar97._20_4_ * 0.0;
  auVar108._24_4_ = auVar97._24_4_ * 0.0;
  auVar108._28_4_ = auVar97._28_4_;
  auVar97 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar77 * 9 + 6));
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar97 = vsubps_avx(auVar97,ZEXT1632(auVar83));
  auVar106._0_4_ = auVar85._0_4_ * auVar97._0_4_;
  auVar106._4_4_ = auVar85._4_4_ * auVar97._4_4_;
  auVar106._8_4_ = auVar85._8_4_ * auVar97._8_4_;
  auVar106._12_4_ = auVar85._12_4_ * auVar97._12_4_;
  auVar106._16_4_ = auVar97._16_4_ * 0.0;
  auVar106._20_4_ = auVar97._20_4_ * 0.0;
  auVar106._24_4_ = auVar97._24_4_ * 0.0;
  auVar106._28_4_ = 0;
  auVar97 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar77 * 0xe + 6));
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar97 = vsubps_avx(auVar97,ZEXT1632(auVar9));
  auVar107._4_4_ = auVar84._4_4_ * auVar97._4_4_;
  auVar107._0_4_ = auVar84._0_4_ * auVar97._0_4_;
  auVar107._8_4_ = auVar84._8_4_ * auVar97._8_4_;
  auVar107._12_4_ = auVar84._12_4_ * auVar97._12_4_;
  auVar107._16_4_ = auVar97._16_4_ * 0.0;
  auVar107._20_4_ = auVar97._20_4_ * 0.0;
  auVar107._24_4_ = auVar97._24_4_ * 0.0;
  auVar107._28_4_ = auVar97._28_4_;
  auVar98 = vpbroadcastd_avx512vl();
  auVar97 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)prim[1] * 0x10 + 6));
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar97 = vsubps_avx(auVar97,ZEXT1632(auVar9));
  auVar94 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar77 * 0x15 + 6));
  auVar104._0_4_ = auVar84._0_4_ * auVar97._0_4_;
  auVar104._4_4_ = auVar84._4_4_ * auVar97._4_4_;
  auVar104._8_4_ = auVar84._8_4_ * auVar97._8_4_;
  auVar104._12_4_ = auVar84._12_4_ * auVar97._12_4_;
  auVar104._16_4_ = auVar97._16_4_ * 0.0;
  auVar104._20_4_ = auVar97._20_4_ * 0.0;
  auVar104._24_4_ = auVar97._24_4_ * 0.0;
  auVar104._28_4_ = 0;
  auVar97 = vcvtdq2ps_avx(auVar94);
  auVar97 = vsubps_avx(auVar97,ZEXT1632(auVar10));
  auVar100._4_4_ = auVar97._4_4_ * auVar89._4_4_;
  auVar100._0_4_ = auVar97._0_4_ * auVar89._0_4_;
  auVar100._8_4_ = auVar97._8_4_ * auVar89._8_4_;
  auVar100._12_4_ = auVar97._12_4_ * auVar89._12_4_;
  auVar100._16_4_ = auVar97._16_4_ * 0.0;
  auVar100._20_4_ = auVar97._20_4_ * 0.0;
  auVar100._24_4_ = auVar97._24_4_ * 0.0;
  auVar100._28_4_ = auVar97._28_4_;
  auVar97 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar77 * 0x17 + 6));
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar97 = vsubps_avx(auVar97,ZEXT1632(auVar10));
  auVar103._0_4_ = auVar89._0_4_ * auVar97._0_4_;
  auVar103._4_4_ = auVar89._4_4_ * auVar97._4_4_;
  auVar103._8_4_ = auVar89._8_4_ * auVar97._8_4_;
  auVar103._12_4_ = auVar89._12_4_ * auVar97._12_4_;
  auVar103._16_4_ = auVar97._16_4_ * 0.0;
  auVar103._20_4_ = auVar97._20_4_ * 0.0;
  auVar103._24_4_ = auVar97._24_4_ * 0.0;
  auVar103._28_4_ = 0;
  auVar97 = vpminsd_avx2(auVar108,auVar106);
  auVar94 = vpminsd_avx2(auVar107,auVar104);
  auVar97 = vmaxps_avx(auVar97,auVar94);
  auVar94 = vpminsd_avx2(auVar100,auVar103);
  uVar139 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar95._4_4_ = uVar139;
  auVar95._0_4_ = uVar139;
  auVar95._8_4_ = uVar139;
  auVar95._12_4_ = uVar139;
  auVar95._16_4_ = uVar139;
  auVar95._20_4_ = uVar139;
  auVar95._24_4_ = uVar139;
  auVar95._28_4_ = uVar139;
  auVar94 = vmaxps_avx512vl(auVar94,auVar95);
  auVar97 = vmaxps_avx(auVar97,auVar94);
  auVar94._8_4_ = 0x3f7ffffa;
  auVar94._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar94._12_4_ = 0x3f7ffffa;
  auVar94._16_4_ = 0x3f7ffffa;
  auVar94._20_4_ = 0x3f7ffffa;
  auVar94._24_4_ = 0x3f7ffffa;
  auVar94._28_4_ = 0x3f7ffffa;
  local_80 = vmulps_avx512vl(auVar97,auVar94);
  auVar97 = vpmaxsd_avx2(auVar108,auVar106);
  auVar94 = vpmaxsd_avx2(auVar107,auVar104);
  auVar97 = vminps_avx(auVar97,auVar94);
  auVar94 = vpmaxsd_avx2(auVar100,auVar103);
  uVar139 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar96._4_4_ = uVar139;
  auVar96._0_4_ = uVar139;
  auVar96._8_4_ = uVar139;
  auVar96._12_4_ = uVar139;
  auVar96._16_4_ = uVar139;
  auVar96._20_4_ = uVar139;
  auVar96._24_4_ = uVar139;
  auVar96._28_4_ = uVar139;
  auVar94 = vminps_avx512vl(auVar94,auVar96);
  auVar97 = vminps_avx(auVar97,auVar94);
  auVar99._8_4_ = 0x3f800003;
  auVar99._0_8_ = 0x3f8000033f800003;
  auVar99._12_4_ = 0x3f800003;
  auVar99._16_4_ = 0x3f800003;
  auVar99._20_4_ = 0x3f800003;
  auVar99._24_4_ = 0x3f800003;
  auVar99._28_4_ = 0x3f800003;
  auVar97 = vmulps_avx512vl(auVar97,auVar99);
  uVar146 = vcmpps_avx512vl(local_80,auVar97,2);
  uVar24 = vpcmpgtd_avx512vl(auVar98,_DAT_01fb4ba0);
  local_448 = CONCAT44((int)((ulong)unaff_R13 >> 0x20),(uint)(byte)((byte)uVar146 & (byte)uVar24));
  local_450 = pre->ray_space + k;
  local_3a0 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_578 = pre;
  while (local_448 != 0) {
    lVar78 = 0;
    for (uVar80 = local_448; (uVar80 & 1) == 0; uVar80 = uVar80 >> 1 | 0x8000000000000000) {
      lVar78 = lVar78 + 1;
    }
    local_5c8 = (ulong)*(uint *)(prim + 2);
    pGVar14 = (context->scene->geometries).items[local_5c8].ptr;
    uVar80 = (ulong)*(uint *)(*(long *)&pGVar14->field_0x58 +
                             pGVar14[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>
                             ._M_i * (ulong)*(uint *)(prim + lVar78 * 4 + 6));
    p_Var15 = pGVar14[1].intersectionFilterN;
    lVar78 = *(long *)&pGVar14[1].time_range.upper;
    local_5c0 = *(undefined1 (*) [16])(lVar78 + (long)p_Var15 * uVar80);
    pauVar4 = (undefined1 (*) [16])(lVar78 + (uVar80 + 1) * (long)p_Var15);
    local_5a0 = *(undefined8 *)*pauVar4;
    uStack_598 = *(undefined8 *)(*pauVar4 + 8);
    auVar85 = *pauVar4;
    pauVar5 = (undefined1 (*) [16])(lVar78 + (uVar80 + 2) * (long)p_Var15);
    local_5b0 = *(undefined8 *)*pauVar5;
    uStack_5a8 = *(undefined8 *)(*pauVar5 + 8);
    auVar84 = *pauVar5;
    uVar77 = local_448 - 1 & local_448;
    pauVar6 = (undefined1 (*) [12])(lVar78 + (uVar80 + 3) * (long)p_Var15);
    local_4f0 = (float)*(undefined8 *)*pauVar6;
    fStack_4ec = (float)((ulong)*(undefined8 *)*pauVar6 >> 0x20);
    fStack_4e8 = (float)*(undefined8 *)(*pauVar6 + 8);
    fStack_4e4 = (float)((ulong)*(undefined8 *)(*pauVar6 + 8) >> 0x20);
    if (uVar77 != 0) {
      uVar75 = uVar77 - 1 & uVar77;
      for (uVar80 = uVar77; (uVar80 & 1) == 0; uVar80 = uVar80 >> 1 | 0x8000000000000000) {
      }
      if (uVar75 != 0) {
        for (; (uVar75 & 1) == 0; uVar75 = uVar75 >> 1 | 0x8000000000000000) {
        }
      }
    }
    iVar13 = (int)pGVar14[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar89 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                            0x1c);
    auVar89 = vinsertps_avx(auVar89,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
    auVar9 = vsubps_avx(local_5c0,auVar89);
    uVar139 = auVar9._0_4_;
    auVar148._4_4_ = uVar139;
    auVar148._0_4_ = uVar139;
    auVar148._8_4_ = uVar139;
    auVar148._12_4_ = uVar139;
    auVar83 = vshufps_avx(auVar9,auVar9,0x55);
    auVar9 = vshufps_avx(auVar9,auVar9,0xaa);
    aVar7 = (local_450->vx).field_0;
    aVar8 = (local_450->vy).field_0;
    fVar152 = (local_450->vz).field_0.m128[0];
    fVar138 = *(float *)((long)&(local_450->vz).field_0 + 4);
    fVar144 = *(float *)((long)&(local_450->vz).field_0 + 8);
    fVar145 = *(float *)((long)&(local_450->vz).field_0 + 0xc);
    auVar171._0_4_ = fVar152 * auVar9._0_4_;
    auVar171._4_4_ = fVar138 * auVar9._4_4_;
    auVar171._8_4_ = fVar144 * auVar9._8_4_;
    auVar171._12_4_ = fVar145 * auVar9._12_4_;
    auVar83 = vfmadd231ps_fma(auVar171,(undefined1  [16])aVar8,auVar83);
    auVar11 = vfmadd231ps_fma(auVar83,(undefined1  [16])aVar7,auVar148);
    auVar83 = vshufps_avx(local_5c0,local_5c0,0xff);
    auVar10 = vsubps_avx(auVar85,auVar89);
    uVar139 = auVar10._0_4_;
    auVar87._4_4_ = uVar139;
    auVar87._0_4_ = uVar139;
    auVar87._8_4_ = uVar139;
    auVar87._12_4_ = uVar139;
    auVar9 = vshufps_avx(auVar10,auVar10,0x55);
    auVar10 = vshufps_avx(auVar10,auVar10,0xaa);
    auVar174._0_4_ = fVar152 * auVar10._0_4_;
    auVar174._4_4_ = fVar138 * auVar10._4_4_;
    auVar174._8_4_ = fVar144 * auVar10._8_4_;
    auVar174._12_4_ = fVar145 * auVar10._12_4_;
    auVar9 = vfmadd231ps_fma(auVar174,(undefined1  [16])aVar8,auVar9);
    auVar12 = vfmadd231ps_fma(auVar9,(undefined1  [16])aVar7,auVar87);
    auVar85 = vshufps_avx(auVar85,auVar85,0xff);
    auVar10 = vsubps_avx(auVar84,auVar89);
    uVar139 = auVar10._0_4_;
    auVar168._4_4_ = uVar139;
    auVar168._0_4_ = uVar139;
    auVar168._8_4_ = uVar139;
    auVar168._12_4_ = uVar139;
    auVar9 = vshufps_avx(auVar10,auVar10,0x55);
    auVar10 = vshufps_avx(auVar10,auVar10,0xaa);
    auVar176._0_4_ = fVar152 * auVar10._0_4_;
    auVar176._4_4_ = fVar138 * auVar10._4_4_;
    auVar176._8_4_ = fVar144 * auVar10._8_4_;
    auVar176._12_4_ = fVar145 * auVar10._12_4_;
    auVar9 = vfmadd231ps_fma(auVar176,(undefined1  [16])aVar8,auVar9);
    auVar10 = vfmadd231ps_fma(auVar9,(undefined1  [16])aVar7,auVar168);
    auVar84 = vshufps_avx(auVar84,auVar84,0xff);
    auVar22._12_4_ = fStack_4e4;
    auVar22._0_12_ = *pauVar6;
    auVar9 = vsubps_avx(auVar22,auVar89);
    uVar139 = auVar9._0_4_;
    auVar153._4_4_ = uVar139;
    auVar153._0_4_ = uVar139;
    auVar153._8_4_ = uVar139;
    auVar153._12_4_ = uVar139;
    auVar89 = vshufps_avx(auVar9,auVar9,0x55);
    auVar9 = vshufps_avx(auVar9,auVar9,0xaa);
    auVar178._0_4_ = fVar152 * auVar9._0_4_;
    auVar178._4_4_ = fVar138 * auVar9._4_4_;
    auVar178._8_4_ = fVar144 * auVar9._8_4_;
    auVar178._12_4_ = fVar145 * auVar9._12_4_;
    auVar89 = vfmadd231ps_fma(auVar178,(undefined1  [16])aVar8,auVar89);
    auVar9 = vfmadd231ps_fma(auVar89,(undefined1  [16])aVar7,auVar153);
    auVar89 = vshufps_avx(auVar22,auVar22,0xff);
    lVar78 = (long)iVar13 * 0x44;
    auVar97 = *(undefined1 (*) [32])(bezier_basis0 + lVar78);
    local_3c0 = vbroadcastss_avx512vl(auVar11);
    auVar158._8_4_ = 1;
    auVar158._0_8_ = 0x100000001;
    auVar158._12_4_ = 1;
    auVar158._16_4_ = 1;
    auVar158._20_4_ = 1;
    auVar158._24_4_ = 1;
    auVar158._28_4_ = 1;
    local_3e0 = vpermps_avx512vl(auVar158,ZEXT1632(auVar11));
    uVar146 = auVar83._0_8_;
    local_a0._8_8_ = uVar146;
    local_a0._0_8_ = uVar146;
    local_a0._16_8_ = uVar146;
    local_a0._24_8_ = uVar146;
    auVar94 = *(undefined1 (*) [32])(bezier_basis0 + lVar78 + 0x484);
    local_420 = vbroadcastss_avx512vl(auVar12);
    local_400 = vpermps_avx2(auVar158,ZEXT1632(auVar12));
    uVar146 = auVar85._0_8_;
    local_c0._8_8_ = uVar146;
    local_c0._0_8_ = uVar146;
    local_c0._16_8_ = uVar146;
    local_c0._24_8_ = uVar146;
    auVar95 = *(undefined1 (*) [32])(bezier_basis0 + lVar78 + 0x908);
    uVar139 = auVar10._0_4_;
    auVar149._4_4_ = uVar139;
    auVar149._0_4_ = uVar139;
    auVar149._8_4_ = uVar139;
    auVar149._12_4_ = uVar139;
    local_540._16_4_ = uVar139;
    local_540._0_16_ = auVar149;
    local_540._20_4_ = uVar139;
    local_540._24_4_ = uVar139;
    local_540._28_4_ = uVar139;
    local_4e0 = vpermps_avx512vl(auVar158,ZEXT1632(auVar10));
    local_e0 = vbroadcastsd_avx512vl(auVar84);
    auVar96 = *(undefined1 (*) [32])(bezier_basis0 + lVar78 + 0xd8c);
    local_4a0 = vbroadcastss_avx512vl(auVar9);
    auVar191 = ZEXT3264(local_4a0);
    local_4c0 = vpermps_avx512vl(auVar158,ZEXT1632(auVar9));
    auVar192 = ZEXT3264(local_4c0);
    _local_100 = vbroadcastsd_avx512vl(auVar89);
    auVar99 = vmulps_avx512vl(local_4a0,auVar96);
    auVar98 = vmulps_avx512vl(local_4c0,auVar96);
    auVar85 = vfmadd231ps_fma(auVar99,auVar95,local_540);
    auVar99 = vfmadd231ps_avx512vl(auVar98,auVar95,local_4e0);
    auVar98 = vfmadd231ps_avx512vl(ZEXT1632(auVar85),auVar94,local_420);
    auVar85 = vfmadd231ps_fma(auVar99,auVar94,local_400);
    auVar100 = vfmadd231ps_avx512vl(auVar98,auVar97,local_3c0);
    auVar101 = vfmadd231ps_avx512vl(ZEXT1632(auVar85),auVar97,local_3e0);
    auVar99 = *(undefined1 (*) [32])(bezier_basis1 + lVar78);
    auVar98 = *(undefined1 (*) [32])(bezier_basis1 + lVar78 + 0x484);
    auVar108 = *(undefined1 (*) [32])(bezier_basis1 + lVar78 + 0x908);
    auVar107 = *(undefined1 (*) [32])(bezier_basis1 + lVar78 + 0xd8c);
    auVar102 = vmulps_avx512vl(local_4a0,auVar107);
    auVar93 = vmulps_avx512vl(local_4c0,auVar107);
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar108,local_540);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar108,local_4e0);
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar98,local_420);
    auVar194 = ZEXT3264(local_400);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar98,local_400);
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar99,local_3c0);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar99,local_3e0);
    auVar91 = vsubps_avx512vl(auVar102,auVar100);
    auVar92 = vsubps_avx512vl(auVar93,auVar101);
    auVar103 = vmulps_avx512vl(auVar101,auVar91);
    auVar104 = vmulps_avx512vl(auVar100,auVar92);
    auVar103 = vsubps_avx512vl(auVar103,auVar104);
    auVar104 = vmulps_avx512vl(_local_100,auVar96);
    auVar104 = vfmadd231ps_avx512vl(auVar104,auVar95,local_e0);
    auVar85 = vfmadd231ps_fma(auVar104,auVar94,local_c0);
    auVar104 = vfmadd231ps_avx512vl(ZEXT1632(auVar85),auVar97,local_a0);
    auVar105 = vmulps_avx512vl(_local_100,auVar107);
    auVar105 = vfmadd231ps_avx512vl(auVar105,auVar108,local_e0);
    auVar105 = vfmadd231ps_avx512vl(auVar105,auVar98,local_c0);
    auVar89 = vfmadd231ps_fma(auVar105,auVar99,local_a0);
    auVar105 = vmulps_avx512vl(auVar92,auVar92);
    auVar105 = vfmadd231ps_avx512vl(auVar105,auVar91,auVar91);
    auVar106 = vmaxps_avx512vl(auVar104,ZEXT1632(auVar89));
    auVar106 = vmulps_avx512vl(auVar106,auVar106);
    auVar105 = vmulps_avx512vl(auVar106,auVar105);
    auVar103 = vmulps_avx512vl(auVar103,auVar103);
    uVar146 = vcmpps_avx512vl(auVar103,auVar105,2);
    auVar85 = vblendps_avx(auVar11,local_5c0,8);
    auVar83 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar84 = vandps_avx512vl(auVar85,auVar83);
    auVar85 = vblendps_avx(auVar12,*pauVar4,8);
    auVar85 = vandps_avx512vl(auVar85,auVar83);
    auVar84 = vmaxps_avx(auVar84,auVar85);
    auVar85 = vblendps_avx(auVar10,*pauVar5,8);
    auVar86 = vandps_avx512vl(auVar85,auVar83);
    auVar23._12_4_ = fStack_4e4;
    auVar23._0_12_ = *pauVar6;
    auVar85 = vblendps_avx(auVar9,auVar23,8);
    auVar85 = vandps_avx512vl(auVar85,auVar83);
    auVar85 = vmaxps_avx(auVar86,auVar85);
    auVar85 = vmaxps_avx(auVar84,auVar85);
    auVar84 = vmovshdup_avx(auVar85);
    auVar84 = vmaxss_avx(auVar84,auVar85);
    auVar85 = vshufpd_avx(auVar85,auVar85,1);
    local_500._0_4_ = (undefined4)iVar13;
    local_500._4_12_ = auVar11._4_12_;
    auVar85 = vmaxss_avx(auVar85,auVar84);
    auVar177._4_4_ = local_500._0_4_;
    auVar177._0_4_ = local_500._0_4_;
    auVar177._8_4_ = local_500._0_4_;
    auVar177._12_4_ = local_500._0_4_;
    auVar177._16_4_ = local_500._0_4_;
    auVar177._20_4_ = local_500._0_4_;
    auVar177._24_4_ = local_500._0_4_;
    auVar177._28_4_ = local_500._0_4_;
    uVar24 = vcmpps_avx512vl(auVar177,_DAT_01f7b060,0xe);
    bVar79 = (byte)uVar146 & (byte)uVar24;
    local_2a0 = auVar85._0_4_ * 4.7683716e-07;
    auVar156._8_4_ = 2;
    auVar156._0_8_ = 0x200000002;
    auVar156._12_4_ = 2;
    auVar156._16_4_ = 2;
    auVar156._20_4_ = 2;
    auVar156._24_4_ = 2;
    auVar156._28_4_ = 2;
    local_120 = vpermps_avx512vl(auVar156,ZEXT1632(auVar11));
    local_140 = vpermps_avx512vl(auVar156,ZEXT1632(auVar12));
    local_160 = vpermps_avx512vl(auVar156,ZEXT1632(auVar10));
    local_480 = vpermps_avx2(auVar156,ZEXT1632(auVar9));
    uVar173 = *(uint *)(ray + k * 4 + 0x30);
    local_390 = vpbroadcastd_avx512vl();
    auVar85 = ZEXT416((uint)local_2a0);
    if (bVar79 == 0) {
      bVar76 = false;
      auVar85 = vxorps_avx512vl(auVar107._0_16_,auVar107._0_16_);
      auVar186 = ZEXT1664(auVar85);
      auVar187 = ZEXT3264(local_3c0);
      auVar188 = ZEXT3264(local_3e0);
      auVar189 = ZEXT3264(local_420);
      auVar97 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar193 = ZEXT3264(auVar97);
      auVar185 = ZEXT3264(local_540);
      auVar190 = ZEXT3264(local_4e0);
    }
    else {
      local_440._0_16_ = ZEXT416(uVar173);
      auVar107 = vmulps_avx512vl(local_480,auVar107);
      auVar108 = vfmadd213ps_avx512vl(auVar108,local_160,auVar107);
      auVar98 = vfmadd213ps_avx512vl(auVar98,local_140,auVar108);
      auVar98 = vfmadd213ps_avx512vl(auVar99,local_120,auVar98);
      auVar96 = vmulps_avx512vl(local_480,auVar96);
      auVar95 = vfmadd213ps_avx512vl(auVar95,local_160,auVar96);
      auVar108 = vfmadd213ps_avx512vl(auVar94,local_140,auVar95);
      auVar94 = *(undefined1 (*) [32])(bezier_basis0 + lVar78 + 0x1210);
      auVar95 = *(undefined1 (*) [32])(bezier_basis0 + lVar78 + 0x1694);
      auVar96 = *(undefined1 (*) [32])(bezier_basis0 + lVar78 + 0x1b18);
      auVar99 = *(undefined1 (*) [32])(bezier_basis0 + lVar78 + 0x1f9c);
      auVar108 = vfmadd213ps_avx512vl(auVar97,local_120,auVar108);
      auVar97 = vmulps_avx512vl(local_4a0,auVar99);
      auVar107 = vmulps_avx512vl(local_4c0,auVar99);
      auVar99 = vmulps_avx512vl(local_480,auVar99);
      auVar84 = vfmadd231ps_fma(auVar97,auVar96,local_540);
      auVar97 = vfmadd231ps_avx512vl(auVar107,auVar96,local_4e0);
      auVar96 = vfmadd231ps_avx512vl(auVar99,local_160,auVar96);
      auVar99 = vfmadd231ps_avx512vl(ZEXT1632(auVar84),auVar95,local_420);
      auVar97 = vfmadd231ps_avx512vl(auVar97,auVar95,local_400);
      auVar107 = vfmadd231ps_avx512vl(auVar96,local_140,auVar95);
      auVar84 = vfmadd231ps_fma(auVar99,auVar94,local_3c0);
      auVar99 = vfmadd231ps_avx512vl(auVar97,auVar94,local_3e0);
      auVar97 = *(undefined1 (*) [32])(bezier_basis1 + lVar78 + 0x1210);
      auVar95 = *(undefined1 (*) [32])(bezier_basis1 + lVar78 + 0x1b18);
      auVar96 = *(undefined1 (*) [32])(bezier_basis1 + lVar78 + 0x1f9c);
      auVar107 = vfmadd231ps_avx512vl(auVar107,local_120,auVar94);
      auVar94 = vmulps_avx512vl(local_4a0,auVar96);
      auVar103 = vmulps_avx512vl(local_4c0,auVar96);
      auVar96 = vmulps_avx512vl(local_480,auVar96);
      auVar105 = vfmadd231ps_avx512vl(auVar94,auVar95,local_540);
      auVar103 = vfmadd231ps_avx512vl(auVar103,auVar95,local_4e0);
      auVar95 = vfmadd231ps_avx512vl(auVar96,local_160,auVar95);
      auVar94 = *(undefined1 (*) [32])(bezier_basis1 + lVar78 + 0x1694);
      auVar96 = vfmadd231ps_avx512vl(auVar105,auVar94,local_420);
      auVar103 = vfmadd231ps_avx512vl(auVar103,auVar94,local_400);
      auVar94 = vfmadd231ps_avx512vl(auVar95,local_140,auVar94);
      auVar83 = vfmadd231ps_fma(auVar96,auVar97,local_3c0);
      auVar95 = vfmadd231ps_avx512vl(auVar103,auVar97,local_3e0);
      auVar96 = vfmadd231ps_avx512vl(auVar94,local_120,auVar97);
      auVar183._8_4_ = 0x7fffffff;
      auVar183._0_8_ = 0x7fffffff7fffffff;
      auVar183._12_4_ = 0x7fffffff;
      auVar183._16_4_ = 0x7fffffff;
      auVar183._20_4_ = 0x7fffffff;
      auVar183._24_4_ = 0x7fffffff;
      auVar183._28_4_ = 0x7fffffff;
      auVar97 = vandps_avx(ZEXT1632(auVar84),auVar183);
      auVar94 = vandps_avx(auVar99,auVar183);
      auVar94 = vmaxps_avx(auVar97,auVar94);
      auVar97 = vandps_avx(auVar107,auVar183);
      auVar97 = vmaxps_avx(auVar94,auVar97);
      auVar107 = vbroadcastss_avx512vl(auVar85);
      uVar80 = vcmpps_avx512vl(auVar97,auVar107,1);
      bVar76 = (bool)((byte)uVar80 & 1);
      auVar109._0_4_ = (float)((uint)bVar76 * auVar91._0_4_ | (uint)!bVar76 * auVar84._0_4_);
      bVar76 = (bool)((byte)(uVar80 >> 1) & 1);
      auVar109._4_4_ = (float)((uint)bVar76 * auVar91._4_4_ | (uint)!bVar76 * auVar84._4_4_);
      bVar76 = (bool)((byte)(uVar80 >> 2) & 1);
      auVar109._8_4_ = (float)((uint)bVar76 * auVar91._8_4_ | (uint)!bVar76 * auVar84._8_4_);
      bVar76 = (bool)((byte)(uVar80 >> 3) & 1);
      auVar109._12_4_ = (float)((uint)bVar76 * auVar91._12_4_ | (uint)!bVar76 * auVar84._12_4_);
      fVar138 = (float)((uint)((byte)(uVar80 >> 4) & 1) * auVar91._16_4_);
      auVar109._16_4_ = fVar138;
      fVar152 = (float)((uint)((byte)(uVar80 >> 5) & 1) * auVar91._20_4_);
      auVar109._20_4_ = fVar152;
      fVar144 = (float)((uint)((byte)(uVar80 >> 6) & 1) * auVar91._24_4_);
      auVar109._24_4_ = fVar144;
      uVar1 = (uint)(byte)(uVar80 >> 7) * auVar91._28_4_;
      auVar109._28_4_ = uVar1;
      bVar76 = (bool)((byte)uVar80 & 1);
      auVar110._0_4_ = (float)((uint)bVar76 * auVar92._0_4_ | (uint)!bVar76 * auVar99._0_4_);
      bVar76 = (bool)((byte)(uVar80 >> 1) & 1);
      auVar110._4_4_ = (float)((uint)bVar76 * auVar92._4_4_ | (uint)!bVar76 * auVar99._4_4_);
      bVar76 = (bool)((byte)(uVar80 >> 2) & 1);
      auVar110._8_4_ = (float)((uint)bVar76 * auVar92._8_4_ | (uint)!bVar76 * auVar99._8_4_);
      bVar76 = (bool)((byte)(uVar80 >> 3) & 1);
      auVar110._12_4_ = (float)((uint)bVar76 * auVar92._12_4_ | (uint)!bVar76 * auVar99._12_4_);
      bVar76 = (bool)((byte)(uVar80 >> 4) & 1);
      auVar110._16_4_ = (float)((uint)bVar76 * auVar92._16_4_ | (uint)!bVar76 * auVar99._16_4_);
      bVar76 = (bool)((byte)(uVar80 >> 5) & 1);
      auVar110._20_4_ = (float)((uint)bVar76 * auVar92._20_4_ | (uint)!bVar76 * auVar99._20_4_);
      bVar76 = (bool)((byte)(uVar80 >> 6) & 1);
      auVar110._24_4_ = (float)((uint)bVar76 * auVar92._24_4_ | (uint)!bVar76 * auVar99._24_4_);
      bVar76 = SUB81(uVar80 >> 7,0);
      auVar110._28_4_ = (uint)bVar76 * auVar92._28_4_ | (uint)!bVar76 * auVar99._28_4_;
      auVar97 = vandps_avx(auVar183,ZEXT1632(auVar83));
      auVar94 = vandps_avx(auVar95,auVar183);
      auVar94 = vmaxps_avx(auVar97,auVar94);
      auVar97 = vandps_avx(auVar96,auVar183);
      auVar97 = vmaxps_avx(auVar94,auVar97);
      uVar80 = vcmpps_avx512vl(auVar97,auVar107,1);
      bVar76 = (bool)((byte)uVar80 & 1);
      auVar111._0_4_ = (float)((uint)bVar76 * auVar91._0_4_ | (uint)!bVar76 * auVar83._0_4_);
      bVar76 = (bool)((byte)(uVar80 >> 1) & 1);
      auVar111._4_4_ = (float)((uint)bVar76 * auVar91._4_4_ | (uint)!bVar76 * auVar83._4_4_);
      bVar76 = (bool)((byte)(uVar80 >> 2) & 1);
      auVar111._8_4_ = (float)((uint)bVar76 * auVar91._8_4_ | (uint)!bVar76 * auVar83._8_4_);
      bVar76 = (bool)((byte)(uVar80 >> 3) & 1);
      auVar111._12_4_ = (float)((uint)bVar76 * auVar91._12_4_ | (uint)!bVar76 * auVar83._12_4_);
      fVar145 = (float)((uint)((byte)(uVar80 >> 4) & 1) * auVar91._16_4_);
      auVar111._16_4_ = fVar145;
      fVar166 = (float)((uint)((byte)(uVar80 >> 5) & 1) * auVar91._20_4_);
      auVar111._20_4_ = fVar166;
      fVar167 = (float)((uint)((byte)(uVar80 >> 6) & 1) * auVar91._24_4_);
      auVar111._24_4_ = fVar167;
      auVar111._28_4_ = (uint)(byte)(uVar80 >> 7) * auVar91._28_4_;
      bVar76 = (bool)((byte)uVar80 & 1);
      auVar112._0_4_ = (float)((uint)bVar76 * auVar92._0_4_ | (uint)!bVar76 * auVar95._0_4_);
      bVar76 = (bool)((byte)(uVar80 >> 1) & 1);
      auVar112._4_4_ = (float)((uint)bVar76 * auVar92._4_4_ | (uint)!bVar76 * auVar95._4_4_);
      bVar76 = (bool)((byte)(uVar80 >> 2) & 1);
      auVar112._8_4_ = (float)((uint)bVar76 * auVar92._8_4_ | (uint)!bVar76 * auVar95._8_4_);
      bVar76 = (bool)((byte)(uVar80 >> 3) & 1);
      auVar112._12_4_ = (float)((uint)bVar76 * auVar92._12_4_ | (uint)!bVar76 * auVar95._12_4_);
      bVar76 = (bool)((byte)(uVar80 >> 4) & 1);
      auVar112._16_4_ = (float)((uint)bVar76 * auVar92._16_4_ | (uint)!bVar76 * auVar95._16_4_);
      bVar76 = (bool)((byte)(uVar80 >> 5) & 1);
      auVar112._20_4_ = (float)((uint)bVar76 * auVar92._20_4_ | (uint)!bVar76 * auVar95._20_4_);
      bVar76 = (bool)((byte)(uVar80 >> 6) & 1);
      auVar112._24_4_ = (float)((uint)bVar76 * auVar92._24_4_ | (uint)!bVar76 * auVar95._24_4_);
      bVar76 = SUB81(uVar80 >> 7,0);
      auVar112._28_4_ = (uint)bVar76 * auVar92._28_4_ | (uint)!bVar76 * auVar95._28_4_;
      auVar87 = vxorps_avx512vl(auVar149,auVar149);
      auVar186 = ZEXT1664(auVar87);
      auVar97 = vfmadd213ps_avx512vl(auVar109,auVar109,ZEXT1632(auVar87));
      auVar84 = vfmadd231ps_fma(auVar97,auVar110,auVar110);
      auVar97 = vrsqrt14ps_avx512vl(ZEXT1632(auVar84));
      fVar81 = auVar97._0_4_;
      fVar82 = auVar97._4_4_;
      fVar151 = auVar97._8_4_;
      fVar130 = auVar97._12_4_;
      fVar131 = auVar97._16_4_;
      fVar132 = auVar97._20_4_;
      fVar134 = auVar97._24_4_;
      auVar32._4_4_ = fVar82 * fVar82 * fVar82 * auVar84._4_4_ * -0.5;
      auVar32._0_4_ = fVar81 * fVar81 * fVar81 * auVar84._0_4_ * -0.5;
      auVar32._8_4_ = fVar151 * fVar151 * fVar151 * auVar84._8_4_ * -0.5;
      auVar32._12_4_ = fVar130 * fVar130 * fVar130 * auVar84._12_4_ * -0.5;
      auVar32._16_4_ = fVar131 * fVar131 * fVar131 * -0.0;
      auVar32._20_4_ = fVar132 * fVar132 * fVar132 * -0.0;
      auVar32._24_4_ = fVar134 * fVar134 * fVar134 * -0.0;
      auVar32._28_4_ = 0;
      auVar94 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
      auVar95 = vfmadd231ps_avx512vl(auVar32,auVar94,auVar97);
      auVar33._4_4_ = auVar110._4_4_ * auVar95._4_4_;
      auVar33._0_4_ = auVar110._0_4_ * auVar95._0_4_;
      auVar33._8_4_ = auVar110._8_4_ * auVar95._8_4_;
      auVar33._12_4_ = auVar110._12_4_ * auVar95._12_4_;
      auVar33._16_4_ = auVar110._16_4_ * auVar95._16_4_;
      auVar33._20_4_ = auVar110._20_4_ * auVar95._20_4_;
      auVar33._24_4_ = auVar110._24_4_ * auVar95._24_4_;
      auVar33._28_4_ = auVar97._28_4_;
      auVar34._4_4_ = auVar95._4_4_ * -auVar109._4_4_;
      auVar34._0_4_ = auVar95._0_4_ * -auVar109._0_4_;
      auVar34._8_4_ = auVar95._8_4_ * -auVar109._8_4_;
      auVar34._12_4_ = auVar95._12_4_ * -auVar109._12_4_;
      auVar34._16_4_ = auVar95._16_4_ * -fVar138;
      auVar34._20_4_ = auVar95._20_4_ * -fVar152;
      auVar34._24_4_ = auVar95._24_4_ * -fVar144;
      auVar34._28_4_ = uVar1 ^ 0x80000000;
      auVar97 = vmulps_avx512vl(auVar95,ZEXT1632(auVar87));
      auVar91 = ZEXT1632(auVar87);
      auVar96 = vfmadd213ps_avx512vl(auVar111,auVar111,auVar91);
      auVar84 = vfmadd231ps_fma(auVar96,auVar112,auVar112);
      auVar96 = vrsqrt14ps_avx512vl(ZEXT1632(auVar84));
      fVar152 = auVar96._0_4_;
      fVar138 = auVar96._4_4_;
      fVar144 = auVar96._8_4_;
      fVar81 = auVar96._12_4_;
      fVar82 = auVar96._16_4_;
      fVar151 = auVar96._20_4_;
      fVar130 = auVar96._24_4_;
      auVar35._4_4_ = fVar138 * fVar138 * fVar138 * auVar84._4_4_ * -0.5;
      auVar35._0_4_ = fVar152 * fVar152 * fVar152 * auVar84._0_4_ * -0.5;
      auVar35._8_4_ = fVar144 * fVar144 * fVar144 * auVar84._8_4_ * -0.5;
      auVar35._12_4_ = fVar81 * fVar81 * fVar81 * auVar84._12_4_ * -0.5;
      auVar35._16_4_ = fVar82 * fVar82 * fVar82 * -0.0;
      auVar35._20_4_ = fVar151 * fVar151 * fVar151 * -0.0;
      auVar35._24_4_ = fVar130 * fVar130 * fVar130 * -0.0;
      auVar35._28_4_ = 0;
      auVar94 = vfmadd231ps_avx512vl(auVar35,auVar94,auVar96);
      auVar36._4_4_ = auVar112._4_4_ * auVar94._4_4_;
      auVar36._0_4_ = auVar112._0_4_ * auVar94._0_4_;
      auVar36._8_4_ = auVar112._8_4_ * auVar94._8_4_;
      auVar36._12_4_ = auVar112._12_4_ * auVar94._12_4_;
      auVar36._16_4_ = auVar112._16_4_ * auVar94._16_4_;
      auVar36._20_4_ = auVar112._20_4_ * auVar94._20_4_;
      auVar36._24_4_ = auVar112._24_4_ * auVar94._24_4_;
      auVar36._28_4_ = auVar96._28_4_;
      auVar37._4_4_ = -auVar111._4_4_ * auVar94._4_4_;
      auVar37._0_4_ = -auVar111._0_4_ * auVar94._0_4_;
      auVar37._8_4_ = -auVar111._8_4_ * auVar94._8_4_;
      auVar37._12_4_ = -auVar111._12_4_ * auVar94._12_4_;
      auVar37._16_4_ = -fVar145 * auVar94._16_4_;
      auVar37._20_4_ = -fVar166 * auVar94._20_4_;
      auVar37._24_4_ = -fVar167 * auVar94._24_4_;
      auVar37._28_4_ = auVar95._28_4_;
      auVar94 = vmulps_avx512vl(auVar94,auVar91);
      auVar84 = vfmadd213ps_fma(auVar33,auVar104,auVar100);
      auVar83 = vfmadd213ps_fma(auVar34,auVar104,auVar101);
      auVar95 = vfmadd213ps_avx512vl(auVar97,auVar104,auVar108);
      auVar96 = vfmadd213ps_avx512vl(auVar36,ZEXT1632(auVar89),auVar102);
      auVar86 = vfnmadd213ps_fma(auVar33,auVar104,auVar100);
      auVar107 = ZEXT1632(auVar89);
      auVar9 = vfmadd213ps_fma(auVar37,auVar107,auVar93);
      auVar22 = vfnmadd213ps_fma(auVar34,auVar104,auVar101);
      auVar10 = vfmadd213ps_fma(auVar94,auVar107,auVar98);
      auVar99 = vfnmadd231ps_avx512vl(auVar108,auVar104,auVar97);
      auVar23 = vfnmadd213ps_fma(auVar36,auVar107,auVar102);
      auVar148 = vfnmadd213ps_fma(auVar37,auVar107,auVar93);
      auVar149 = vfnmadd231ps_fma(auVar98,ZEXT1632(auVar89),auVar94);
      auVar94 = vsubps_avx512vl(auVar96,ZEXT1632(auVar86));
      auVar97 = vsubps_avx(ZEXT1632(auVar9),ZEXT1632(auVar22));
      auVar98 = vsubps_avx512vl(ZEXT1632(auVar10),auVar99);
      auVar108 = vmulps_avx512vl(auVar97,auVar99);
      auVar11 = vfmsub231ps_fma(auVar108,ZEXT1632(auVar22),auVar98);
      auVar38._4_4_ = auVar86._4_4_ * auVar98._4_4_;
      auVar38._0_4_ = auVar86._0_4_ * auVar98._0_4_;
      auVar38._8_4_ = auVar86._8_4_ * auVar98._8_4_;
      auVar38._12_4_ = auVar86._12_4_ * auVar98._12_4_;
      auVar38._16_4_ = auVar98._16_4_ * 0.0;
      auVar38._20_4_ = auVar98._20_4_ * 0.0;
      auVar38._24_4_ = auVar98._24_4_ * 0.0;
      auVar38._28_4_ = auVar98._28_4_;
      auVar98 = vfmsub231ps_avx512vl(auVar38,auVar99,auVar94);
      auVar39._4_4_ = auVar22._4_4_ * auVar94._4_4_;
      auVar39._0_4_ = auVar22._0_4_ * auVar94._0_4_;
      auVar39._8_4_ = auVar22._8_4_ * auVar94._8_4_;
      auVar39._12_4_ = auVar22._12_4_ * auVar94._12_4_;
      auVar39._16_4_ = auVar94._16_4_ * 0.0;
      auVar39._20_4_ = auVar94._20_4_ * 0.0;
      auVar39._24_4_ = auVar94._24_4_ * 0.0;
      auVar39._28_4_ = auVar94._28_4_;
      auVar12 = vfmsub231ps_fma(auVar39,ZEXT1632(auVar86),auVar97);
      auVar97 = vfmadd231ps_avx512vl(ZEXT1632(auVar12),auVar91,auVar98);
      auVar97 = vfmadd231ps_avx512vl(auVar97,auVar91,ZEXT1632(auVar11));
      auVar93 = ZEXT1632(auVar87);
      uVar80 = vcmpps_avx512vl(auVar97,auVar93,2);
      bVar72 = (byte)uVar80;
      fVar81 = (float)((uint)(bVar72 & 1) * auVar84._0_4_ |
                      (uint)!(bool)(bVar72 & 1) * auVar23._0_4_);
      bVar76 = (bool)((byte)(uVar80 >> 1) & 1);
      fVar151 = (float)((uint)bVar76 * auVar84._4_4_ | (uint)!bVar76 * auVar23._4_4_);
      bVar76 = (bool)((byte)(uVar80 >> 2) & 1);
      fVar131 = (float)((uint)bVar76 * auVar84._8_4_ | (uint)!bVar76 * auVar23._8_4_);
      bVar76 = (bool)((byte)(uVar80 >> 3) & 1);
      fVar134 = (float)((uint)bVar76 * auVar84._12_4_ | (uint)!bVar76 * auVar23._12_4_);
      auVar108 = ZEXT1632(CONCAT412(fVar134,CONCAT48(fVar131,CONCAT44(fVar151,fVar81))));
      fVar82 = (float)((uint)(bVar72 & 1) * auVar83._0_4_ |
                      (uint)!(bool)(bVar72 & 1) * auVar148._0_4_);
      bVar76 = (bool)((byte)(uVar80 >> 1) & 1);
      fVar130 = (float)((uint)bVar76 * auVar83._4_4_ | (uint)!bVar76 * auVar148._4_4_);
      bVar76 = (bool)((byte)(uVar80 >> 2) & 1);
      fVar132 = (float)((uint)bVar76 * auVar83._8_4_ | (uint)!bVar76 * auVar148._8_4_);
      bVar76 = (bool)((byte)(uVar80 >> 3) & 1);
      fVar135 = (float)((uint)bVar76 * auVar83._12_4_ | (uint)!bVar76 * auVar148._12_4_);
      auVar107 = ZEXT1632(CONCAT412(fVar135,CONCAT48(fVar132,CONCAT44(fVar130,fVar82))));
      auVar113._0_4_ =
           (float)((uint)(bVar72 & 1) * auVar95._0_4_ | (uint)!(bool)(bVar72 & 1) * auVar149._0_4_);
      bVar76 = (bool)((byte)(uVar80 >> 1) & 1);
      auVar113._4_4_ = (float)((uint)bVar76 * auVar95._4_4_ | (uint)!bVar76 * auVar149._4_4_);
      bVar76 = (bool)((byte)(uVar80 >> 2) & 1);
      auVar113._8_4_ = (float)((uint)bVar76 * auVar95._8_4_ | (uint)!bVar76 * auVar149._8_4_);
      bVar76 = (bool)((byte)(uVar80 >> 3) & 1);
      auVar113._12_4_ = (float)((uint)bVar76 * auVar95._12_4_ | (uint)!bVar76 * auVar149._12_4_);
      fVar138 = (float)((uint)((byte)(uVar80 >> 4) & 1) * auVar95._16_4_);
      auVar113._16_4_ = fVar138;
      fVar144 = (float)((uint)((byte)(uVar80 >> 5) & 1) * auVar95._20_4_);
      auVar113._20_4_ = fVar144;
      fVar152 = (float)((uint)((byte)(uVar80 >> 6) & 1) * auVar95._24_4_);
      auVar113._24_4_ = fVar152;
      iVar2 = (uint)(byte)(uVar80 >> 7) * auVar95._28_4_;
      auVar113._28_4_ = iVar2;
      auVar94 = vblendmps_avx512vl(ZEXT1632(auVar86),auVar96);
      auVar114._0_4_ =
           (uint)(bVar72 & 1) * auVar94._0_4_ | (uint)!(bool)(bVar72 & 1) * auVar83._0_4_;
      bVar76 = (bool)((byte)(uVar80 >> 1) & 1);
      auVar114._4_4_ = (uint)bVar76 * auVar94._4_4_ | (uint)!bVar76 * auVar83._4_4_;
      bVar76 = (bool)((byte)(uVar80 >> 2) & 1);
      auVar114._8_4_ = (uint)bVar76 * auVar94._8_4_ | (uint)!bVar76 * auVar83._8_4_;
      bVar76 = (bool)((byte)(uVar80 >> 3) & 1);
      auVar114._12_4_ = (uint)bVar76 * auVar94._12_4_ | (uint)!bVar76 * auVar83._12_4_;
      auVar114._16_4_ = (uint)((byte)(uVar80 >> 4) & 1) * auVar94._16_4_;
      auVar114._20_4_ = (uint)((byte)(uVar80 >> 5) & 1) * auVar94._20_4_;
      auVar114._24_4_ = (uint)((byte)(uVar80 >> 6) & 1) * auVar94._24_4_;
      auVar114._28_4_ = (uint)(byte)(uVar80 >> 7) * auVar94._28_4_;
      auVar94 = vblendmps_avx512vl(ZEXT1632(auVar22),ZEXT1632(auVar9));
      auVar115._0_4_ =
           (float)((uint)(bVar72 & 1) * auVar94._0_4_ | (uint)!(bool)(bVar72 & 1) * auVar11._0_4_);
      bVar76 = (bool)((byte)(uVar80 >> 1) & 1);
      auVar115._4_4_ = (float)((uint)bVar76 * auVar94._4_4_ | (uint)!bVar76 * auVar11._4_4_);
      bVar76 = (bool)((byte)(uVar80 >> 2) & 1);
      auVar115._8_4_ = (float)((uint)bVar76 * auVar94._8_4_ | (uint)!bVar76 * auVar11._8_4_);
      bVar76 = (bool)((byte)(uVar80 >> 3) & 1);
      auVar115._12_4_ = (float)((uint)bVar76 * auVar94._12_4_ | (uint)!bVar76 * auVar11._12_4_);
      fVar145 = (float)((uint)((byte)(uVar80 >> 4) & 1) * auVar94._16_4_);
      auVar115._16_4_ = fVar145;
      fVar166 = (float)((uint)((byte)(uVar80 >> 5) & 1) * auVar94._20_4_);
      auVar115._20_4_ = fVar166;
      fVar167 = (float)((uint)((byte)(uVar80 >> 6) & 1) * auVar94._24_4_);
      auVar115._24_4_ = fVar167;
      auVar115._28_4_ = (uint)(byte)(uVar80 >> 7) * auVar94._28_4_;
      auVar94 = vblendmps_avx512vl(auVar99,ZEXT1632(auVar10));
      auVar116._0_4_ =
           (float)((uint)(bVar72 & 1) * auVar94._0_4_ | (uint)!(bool)(bVar72 & 1) * auVar95._0_4_);
      bVar76 = (bool)((byte)(uVar80 >> 1) & 1);
      auVar116._4_4_ = (float)((uint)bVar76 * auVar94._4_4_ | (uint)!bVar76 * auVar95._4_4_);
      bVar76 = (bool)((byte)(uVar80 >> 2) & 1);
      auVar116._8_4_ = (float)((uint)bVar76 * auVar94._8_4_ | (uint)!bVar76 * auVar95._8_4_);
      bVar76 = (bool)((byte)(uVar80 >> 3) & 1);
      auVar116._12_4_ = (float)((uint)bVar76 * auVar94._12_4_ | (uint)!bVar76 * auVar95._12_4_);
      bVar76 = (bool)((byte)(uVar80 >> 4) & 1);
      auVar116._16_4_ = (float)((uint)bVar76 * auVar94._16_4_ | (uint)!bVar76 * auVar95._16_4_);
      bVar76 = (bool)((byte)(uVar80 >> 5) & 1);
      auVar116._20_4_ = (float)((uint)bVar76 * auVar94._20_4_ | (uint)!bVar76 * auVar95._20_4_);
      bVar76 = (bool)((byte)(uVar80 >> 6) & 1);
      auVar116._24_4_ = (float)((uint)bVar76 * auVar94._24_4_ | (uint)!bVar76 * auVar95._24_4_);
      bVar76 = SUB81(uVar80 >> 7,0);
      auVar116._28_4_ = (uint)bVar76 * auVar94._28_4_ | (uint)!bVar76 * auVar95._28_4_;
      auVar117._0_4_ =
           (uint)(bVar72 & 1) * (int)auVar86._0_4_ | (uint)!(bool)(bVar72 & 1) * auVar96._0_4_;
      bVar76 = (bool)((byte)(uVar80 >> 1) & 1);
      auVar117._4_4_ = (uint)bVar76 * (int)auVar86._4_4_ | (uint)!bVar76 * auVar96._4_4_;
      bVar76 = (bool)((byte)(uVar80 >> 2) & 1);
      auVar117._8_4_ = (uint)bVar76 * (int)auVar86._8_4_ | (uint)!bVar76 * auVar96._8_4_;
      bVar76 = (bool)((byte)(uVar80 >> 3) & 1);
      auVar117._12_4_ = (uint)bVar76 * (int)auVar86._12_4_ | (uint)!bVar76 * auVar96._12_4_;
      auVar117._16_4_ = (uint)!(bool)((byte)(uVar80 >> 4) & 1) * auVar96._16_4_;
      auVar117._20_4_ = (uint)!(bool)((byte)(uVar80 >> 5) & 1) * auVar96._20_4_;
      auVar117._24_4_ = (uint)!(bool)((byte)(uVar80 >> 6) & 1) * auVar96._24_4_;
      auVar117._28_4_ = (uint)!SUB81(uVar80 >> 7,0) * auVar96._28_4_;
      bVar76 = (bool)((byte)(uVar80 >> 1) & 1);
      bVar17 = (bool)((byte)(uVar80 >> 2) & 1);
      bVar19 = (bool)((byte)(uVar80 >> 3) & 1);
      auVar118._0_4_ =
           (uint)(bVar72 & 1) * auVar99._0_4_ | (uint)!(bool)(bVar72 & 1) * auVar10._0_4_;
      bVar16 = (bool)((byte)(uVar80 >> 1) & 1);
      auVar118._4_4_ = (uint)bVar16 * auVar99._4_4_ | (uint)!bVar16 * auVar10._4_4_;
      bVar16 = (bool)((byte)(uVar80 >> 2) & 1);
      auVar118._8_4_ = (uint)bVar16 * auVar99._8_4_ | (uint)!bVar16 * auVar10._8_4_;
      bVar16 = (bool)((byte)(uVar80 >> 3) & 1);
      auVar118._12_4_ = (uint)bVar16 * auVar99._12_4_ | (uint)!bVar16 * auVar10._12_4_;
      auVar118._16_4_ = (uint)((byte)(uVar80 >> 4) & 1) * auVar99._16_4_;
      auVar118._20_4_ = (uint)((byte)(uVar80 >> 5) & 1) * auVar99._20_4_;
      auVar118._24_4_ = (uint)((byte)(uVar80 >> 6) & 1) * auVar99._24_4_;
      iVar3 = (uint)(byte)(uVar80 >> 7) * auVar99._28_4_;
      auVar118._28_4_ = iVar3;
      auVar100 = vsubps_avx512vl(auVar117,auVar108);
      auVar94 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar19 * (int)auVar22._12_4_ |
                                              (uint)!bVar19 * auVar9._12_4_,
                                              CONCAT48((uint)bVar17 * (int)auVar22._8_4_ |
                                                       (uint)!bVar17 * auVar9._8_4_,
                                                       CONCAT44((uint)bVar76 * (int)auVar22._4_4_ |
                                                                (uint)!bVar76 * auVar9._4_4_,
                                                                (uint)(bVar72 & 1) *
                                                                (int)auVar22._0_4_ |
                                                                (uint)!(bool)(bVar72 & 1) *
                                                                auVar9._0_4_)))),auVar107);
      auVar95 = vsubps_avx(auVar118,auVar113);
      auVar96 = vsubps_avx(auVar108,auVar114);
      auVar99 = vsubps_avx(auVar107,auVar115);
      auVar98 = vsubps_avx(auVar113,auVar116);
      auVar40._4_4_ = auVar95._4_4_ * fVar151;
      auVar40._0_4_ = auVar95._0_4_ * fVar81;
      auVar40._8_4_ = auVar95._8_4_ * fVar131;
      auVar40._12_4_ = auVar95._12_4_ * fVar134;
      auVar40._16_4_ = auVar95._16_4_ * 0.0;
      auVar40._20_4_ = auVar95._20_4_ * 0.0;
      auVar40._24_4_ = auVar95._24_4_ * 0.0;
      auVar40._28_4_ = iVar3;
      auVar84 = vfmsub231ps_fma(auVar40,auVar113,auVar100);
      auVar41._4_4_ = fVar130 * auVar100._4_4_;
      auVar41._0_4_ = fVar82 * auVar100._0_4_;
      auVar41._8_4_ = fVar132 * auVar100._8_4_;
      auVar41._12_4_ = fVar135 * auVar100._12_4_;
      auVar41._16_4_ = auVar100._16_4_ * 0.0;
      auVar41._20_4_ = auVar100._20_4_ * 0.0;
      auVar41._24_4_ = auVar100._24_4_ * 0.0;
      auVar41._28_4_ = auVar97._28_4_;
      auVar83 = vfmsub231ps_fma(auVar41,auVar108,auVar94);
      auVar97 = vfmadd231ps_avx512vl(ZEXT1632(auVar83),auVar93,ZEXT1632(auVar84));
      auVar159._0_4_ = auVar94._0_4_ * auVar113._0_4_;
      auVar159._4_4_ = auVar94._4_4_ * auVar113._4_4_;
      auVar159._8_4_ = auVar94._8_4_ * auVar113._8_4_;
      auVar159._12_4_ = auVar94._12_4_ * auVar113._12_4_;
      auVar159._16_4_ = auVar94._16_4_ * fVar138;
      auVar159._20_4_ = auVar94._20_4_ * fVar144;
      auVar159._24_4_ = auVar94._24_4_ * fVar152;
      auVar159._28_4_ = 0;
      auVar84 = vfmsub231ps_fma(auVar159,auVar107,auVar95);
      auVar101 = vfmadd231ps_avx512vl(auVar97,auVar93,ZEXT1632(auVar84));
      auVar97 = vmulps_avx512vl(auVar98,auVar114);
      auVar97 = vfmsub231ps_avx512vl(auVar97,auVar96,auVar116);
      auVar42._4_4_ = auVar99._4_4_ * auVar116._4_4_;
      auVar42._0_4_ = auVar99._0_4_ * auVar116._0_4_;
      auVar42._8_4_ = auVar99._8_4_ * auVar116._8_4_;
      auVar42._12_4_ = auVar99._12_4_ * auVar116._12_4_;
      auVar42._16_4_ = auVar99._16_4_ * auVar116._16_4_;
      auVar42._20_4_ = auVar99._20_4_ * auVar116._20_4_;
      auVar42._24_4_ = auVar99._24_4_ * auVar116._24_4_;
      auVar42._28_4_ = auVar116._28_4_;
      auVar84 = vfmsub231ps_fma(auVar42,auVar115,auVar98);
      auVar160._0_4_ = auVar115._0_4_ * auVar96._0_4_;
      auVar160._4_4_ = auVar115._4_4_ * auVar96._4_4_;
      auVar160._8_4_ = auVar115._8_4_ * auVar96._8_4_;
      auVar160._12_4_ = auVar115._12_4_ * auVar96._12_4_;
      auVar160._16_4_ = fVar145 * auVar96._16_4_;
      auVar160._20_4_ = fVar166 * auVar96._20_4_;
      auVar160._24_4_ = fVar167 * auVar96._24_4_;
      auVar160._28_4_ = 0;
      auVar83 = vfmsub231ps_fma(auVar160,auVar99,auVar114);
      auVar97 = vfmadd231ps_avx512vl(ZEXT1632(auVar83),auVar93,auVar97);
      auVar102 = vfmadd231ps_avx512vl(auVar97,auVar93,ZEXT1632(auVar84));
      auVar97 = vmaxps_avx(auVar101,auVar102);
      uVar146 = vcmpps_avx512vl(auVar97,auVar93,2);
      bVar79 = bVar79 & (byte)uVar146;
      auVar187 = ZEXT3264(local_3c0);
      auVar188 = ZEXT3264(local_3e0);
      auVar189 = ZEXT3264(local_420);
      auVar185 = ZEXT3264(local_540);
      auVar181 = ZEXT1664(auVar85);
      if (bVar79 == 0) {
        bVar76 = false;
        auVar97 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar193 = ZEXT3264(auVar97);
        auVar190 = ZEXT3264(local_4e0);
        auVar191 = ZEXT3264(local_4a0);
        auVar192 = ZEXT3264(local_4c0);
      }
      else {
        auVar43._4_4_ = auVar98._4_4_ * auVar94._4_4_;
        auVar43._0_4_ = auVar98._0_4_ * auVar94._0_4_;
        auVar43._8_4_ = auVar98._8_4_ * auVar94._8_4_;
        auVar43._12_4_ = auVar98._12_4_ * auVar94._12_4_;
        auVar43._16_4_ = auVar98._16_4_ * auVar94._16_4_;
        auVar43._20_4_ = auVar98._20_4_ * auVar94._20_4_;
        auVar43._24_4_ = auVar98._24_4_ * auVar94._24_4_;
        auVar43._28_4_ = auVar97._28_4_;
        auVar9 = vfmsub231ps_fma(auVar43,auVar99,auVar95);
        auVar44._4_4_ = auVar95._4_4_ * auVar96._4_4_;
        auVar44._0_4_ = auVar95._0_4_ * auVar96._0_4_;
        auVar44._8_4_ = auVar95._8_4_ * auVar96._8_4_;
        auVar44._12_4_ = auVar95._12_4_ * auVar96._12_4_;
        auVar44._16_4_ = auVar95._16_4_ * auVar96._16_4_;
        auVar44._20_4_ = auVar95._20_4_ * auVar96._20_4_;
        auVar44._24_4_ = auVar95._24_4_ * auVar96._24_4_;
        auVar44._28_4_ = auVar95._28_4_;
        auVar83 = vfmsub231ps_fma(auVar44,auVar100,auVar98);
        auVar45._4_4_ = auVar99._4_4_ * auVar100._4_4_;
        auVar45._0_4_ = auVar99._0_4_ * auVar100._0_4_;
        auVar45._8_4_ = auVar99._8_4_ * auVar100._8_4_;
        auVar45._12_4_ = auVar99._12_4_ * auVar100._12_4_;
        auVar45._16_4_ = auVar99._16_4_ * auVar100._16_4_;
        auVar45._20_4_ = auVar99._20_4_ * auVar100._20_4_;
        auVar45._24_4_ = auVar99._24_4_ * auVar100._24_4_;
        auVar45._28_4_ = auVar99._28_4_;
        auVar10 = vfmsub231ps_fma(auVar45,auVar96,auVar94);
        auVar84 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar83),ZEXT1632(auVar10));
        auVar97 = vfmadd231ps_avx512vl(ZEXT1632(auVar84),ZEXT1632(auVar9),auVar93);
        auVar94 = vrcp14ps_avx512vl(auVar97);
        auVar95 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar193 = ZEXT3264(auVar95);
        auVar96 = vfnmadd213ps_avx512vl(auVar94,auVar97,auVar95);
        auVar84 = vfmadd132ps_fma(auVar96,auVar94,auVar94);
        auVar46._4_4_ = auVar10._4_4_ * auVar113._4_4_;
        auVar46._0_4_ = auVar10._0_4_ * auVar113._0_4_;
        auVar46._8_4_ = auVar10._8_4_ * auVar113._8_4_;
        auVar46._12_4_ = auVar10._12_4_ * auVar113._12_4_;
        auVar46._16_4_ = fVar138 * 0.0;
        auVar46._20_4_ = fVar144 * 0.0;
        auVar46._24_4_ = fVar152 * 0.0;
        auVar46._28_4_ = iVar2;
        auVar83 = vfmadd231ps_fma(auVar46,auVar107,ZEXT1632(auVar83));
        auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar108,ZEXT1632(auVar9));
        fVar152 = auVar84._0_4_;
        fVar138 = auVar84._4_4_;
        fVar144 = auVar84._8_4_;
        fVar145 = auVar84._12_4_;
        local_240 = ZEXT1632(CONCAT412(auVar83._12_4_ * fVar145,
                                       CONCAT48(auVar83._8_4_ * fVar144,
                                                CONCAT44(auVar83._4_4_ * fVar138,
                                                         auVar83._0_4_ * fVar152))));
        auVar169._4_4_ = uVar173;
        auVar169._0_4_ = uVar173;
        auVar169._8_4_ = uVar173;
        auVar169._12_4_ = uVar173;
        auVar169._16_4_ = uVar173;
        auVar169._20_4_ = uVar173;
        auVar169._24_4_ = uVar173;
        auVar169._28_4_ = uVar173;
        uVar146 = vcmpps_avx512vl(auVar169,local_240,2);
        uVar139 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar25._4_4_ = uVar139;
        auVar25._0_4_ = uVar139;
        auVar25._8_4_ = uVar139;
        auVar25._12_4_ = uVar139;
        auVar25._16_4_ = uVar139;
        auVar25._20_4_ = uVar139;
        auVar25._24_4_ = uVar139;
        auVar25._28_4_ = uVar139;
        uVar24 = vcmpps_avx512vl(local_240,auVar25,2);
        bVar79 = (byte)uVar146 & (byte)uVar24 & bVar79;
        auVar191 = ZEXT3264(local_4a0);
        auVar192 = ZEXT3264(local_4c0);
        if (bVar79 == 0) {
          bVar76 = false;
          auVar190 = ZEXT3264(local_4e0);
        }
        else {
          uVar146 = vcmpps_avx512vl(auVar97,auVar93,4);
          bVar79 = bVar79 & (byte)uVar146;
          auVar170 = ZEXT1664(local_5c0);
          auVar190 = ZEXT3264(local_4e0);
          if (bVar79 != 0) {
            fVar166 = auVar101._0_4_ * fVar152;
            fVar167 = auVar101._4_4_ * fVar138;
            auVar47._4_4_ = fVar167;
            auVar47._0_4_ = fVar166;
            fVar81 = auVar101._8_4_ * fVar144;
            auVar47._8_4_ = fVar81;
            fVar82 = auVar101._12_4_ * fVar145;
            auVar47._12_4_ = fVar82;
            fVar151 = auVar101._16_4_ * 0.0;
            auVar47._16_4_ = fVar151;
            fVar130 = auVar101._20_4_ * 0.0;
            auVar47._20_4_ = fVar130;
            fVar131 = auVar101._24_4_ * 0.0;
            auVar47._24_4_ = fVar131;
            auVar47._28_4_ = auVar97._28_4_;
            auVar94 = vsubps_avx512vl(auVar95,auVar47);
            local_280._0_4_ =
                 (float)((uint)(bVar72 & 1) * (int)fVar166 |
                        (uint)!(bool)(bVar72 & 1) * auVar94._0_4_);
            bVar76 = (bool)((byte)(uVar80 >> 1) & 1);
            local_280._4_4_ = (float)((uint)bVar76 * (int)fVar167 | (uint)!bVar76 * auVar94._4_4_);
            bVar76 = (bool)((byte)(uVar80 >> 2) & 1);
            local_280._8_4_ = (float)((uint)bVar76 * (int)fVar81 | (uint)!bVar76 * auVar94._8_4_);
            bVar76 = (bool)((byte)(uVar80 >> 3) & 1);
            local_280._12_4_ = (float)((uint)bVar76 * (int)fVar82 | (uint)!bVar76 * auVar94._12_4_);
            bVar76 = (bool)((byte)(uVar80 >> 4) & 1);
            local_280._16_4_ = (float)((uint)bVar76 * (int)fVar151 | (uint)!bVar76 * auVar94._16_4_)
            ;
            bVar76 = (bool)((byte)(uVar80 >> 5) & 1);
            local_280._20_4_ = (float)((uint)bVar76 * (int)fVar130 | (uint)!bVar76 * auVar94._20_4_)
            ;
            bVar76 = (bool)((byte)(uVar80 >> 6) & 1);
            local_280._24_4_ = (float)((uint)bVar76 * (int)fVar131 | (uint)!bVar76 * auVar94._24_4_)
            ;
            bVar76 = SUB81(uVar80 >> 7,0);
            local_280._28_4_ =
                 (float)((uint)bVar76 * auVar97._28_4_ | (uint)!bVar76 * auVar94._28_4_);
            auVar97 = vsubps_avx(ZEXT1632(auVar89),auVar104);
            auVar84 = vfmadd213ps_fma(auVar97,local_280,auVar104);
            uVar139 = *(undefined4 *)((long)local_578->ray_space + k * 4 + -0x10);
            auVar26._4_4_ = uVar139;
            auVar26._0_4_ = uVar139;
            auVar26._8_4_ = uVar139;
            auVar26._12_4_ = uVar139;
            auVar26._16_4_ = uVar139;
            auVar26._20_4_ = uVar139;
            auVar26._24_4_ = uVar139;
            auVar26._28_4_ = uVar139;
            auVar97 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar84._12_4_ + auVar84._12_4_,
                                                         CONCAT48(auVar84._8_4_ + auVar84._8_4_,
                                                                  CONCAT44(auVar84._4_4_ +
                                                                           auVar84._4_4_,
                                                                           auVar84._0_4_ +
                                                                           auVar84._0_4_)))),auVar26
                                     );
            uVar146 = vcmpps_avx512vl(local_240,auVar97,6);
            if (((byte)uVar146 & bVar79) != 0) {
              auVar150._0_4_ = auVar102._0_4_ * fVar152;
              auVar150._4_4_ = auVar102._4_4_ * fVar138;
              auVar150._8_4_ = auVar102._8_4_ * fVar144;
              auVar150._12_4_ = auVar102._12_4_ * fVar145;
              auVar150._16_4_ = auVar102._16_4_ * 0.0;
              auVar150._20_4_ = auVar102._20_4_ * 0.0;
              auVar150._24_4_ = auVar102._24_4_ * 0.0;
              auVar150._28_4_ = 0;
              auVar97 = vsubps_avx512vl(auVar95,auVar150);
              auVar119._0_4_ =
                   (uint)(bVar72 & 1) * (int)auVar150._0_4_ |
                   (uint)!(bool)(bVar72 & 1) * auVar97._0_4_;
              bVar76 = (bool)((byte)(uVar80 >> 1) & 1);
              auVar119._4_4_ = (uint)bVar76 * (int)auVar150._4_4_ | (uint)!bVar76 * auVar97._4_4_;
              bVar76 = (bool)((byte)(uVar80 >> 2) & 1);
              auVar119._8_4_ = (uint)bVar76 * (int)auVar150._8_4_ | (uint)!bVar76 * auVar97._8_4_;
              bVar76 = (bool)((byte)(uVar80 >> 3) & 1);
              auVar119._12_4_ = (uint)bVar76 * (int)auVar150._12_4_ | (uint)!bVar76 * auVar97._12_4_
              ;
              bVar76 = (bool)((byte)(uVar80 >> 4) & 1);
              auVar119._16_4_ = (uint)bVar76 * (int)auVar150._16_4_ | (uint)!bVar76 * auVar97._16_4_
              ;
              bVar76 = (bool)((byte)(uVar80 >> 5) & 1);
              auVar119._20_4_ = (uint)bVar76 * (int)auVar150._20_4_ | (uint)!bVar76 * auVar97._20_4_
              ;
              bVar76 = (bool)((byte)(uVar80 >> 6) & 1);
              auVar119._24_4_ = (uint)bVar76 * (int)auVar150._24_4_ | (uint)!bVar76 * auVar97._24_4_
              ;
              auVar119._28_4_ = (uint)!SUB81(uVar80 >> 7,0) * auVar97._28_4_;
              auVar27._8_4_ = 0x40000000;
              auVar27._0_8_ = 0x4000000040000000;
              auVar27._12_4_ = 0x40000000;
              auVar27._16_4_ = 0x40000000;
              auVar27._20_4_ = 0x40000000;
              auVar27._24_4_ = 0x40000000;
              auVar27._28_4_ = 0x40000000;
              local_260 = vfmsub132ps_avx512vl(auVar119,auVar95,auVar27);
              local_220 = 0;
              if ((pGVar14->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (bVar76 = true, pGVar14->occlusionFilterN == (RTCFilterFunctionN)0x0))
                goto LAB_01a8a83e;
                fVar152 = 1.0 / (float)local_500._0_4_;
                local_1c0[0] = fVar152 * (local_280._0_4_ + 0.0);
                local_1c0[1] = fVar152 * (local_280._4_4_ + 1.0);
                local_1c0[2] = fVar152 * (local_280._8_4_ + 2.0);
                local_1c0[3] = fVar152 * (local_280._12_4_ + 3.0);
                fStack_1b0 = fVar152 * (local_280._16_4_ + 4.0);
                fStack_1ac = fVar152 * (local_280._20_4_ + 5.0);
                fStack_1a8 = fVar152 * (local_280._24_4_ + 6.0);
                fStack_1a4 = local_280._28_4_ + 7.0;
                local_1a0 = local_260;
                local_180 = local_240;
                lVar73 = 0;
                uVar75 = (ulong)((byte)uVar146 & bVar79);
                for (uVar80 = uVar75; (uVar80 & 1) == 0; uVar80 = uVar80 >> 1 | 0x8000000000000000)
                {
                  lVar73 = lVar73 + 1;
                }
                local_510 = vpbroadcastd_avx512vl();
                local_590 = auVar85;
                local_21c = iVar13;
                local_210 = local_5c0;
                local_200 = local_5a0;
                uStack_1f8 = uStack_598;
                local_1f0 = local_5b0;
                uStack_1e8 = uStack_5a8;
                while( true ) {
                  local_2a0 = auVar181._0_4_;
                  auVar85 = auVar186._0_16_;
                  if (uVar75 == 0) break;
                  local_380 = *(float *)(ray + k * 4 + 0x80);
                  local_300 = local_1c0[lVar73];
                  local_2a0 = (float)lVar73;
                  fStack_29c = (float)((ulong)lVar73 >> 0x20);
                  local_2f0 = *(undefined4 *)(local_1a0 + lVar73 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_180 + lVar73 * 4);
                  local_570.context = context->user;
                  fVar138 = 1.0 - local_300;
                  fVar152 = fVar138 * fVar138 * -3.0;
                  auVar84 = vfmadd231ss_fma(ZEXT416((uint)(fVar138 * fVar138)),
                                            ZEXT416((uint)(local_300 * fVar138)),ZEXT416(0xc0000000)
                                           );
                  auVar89 = vfmsub132ss_fma(ZEXT416((uint)(local_300 * fVar138)),
                                            ZEXT416((uint)(local_300 * local_300)),
                                            ZEXT416(0x40000000));
                  fVar138 = auVar84._0_4_ * 3.0;
                  fVar144 = auVar89._0_4_ * 3.0;
                  fVar145 = local_300 * local_300 * 3.0;
                  auVar163._0_4_ = fVar145 * local_4f0;
                  auVar163._4_4_ = fVar145 * fStack_4ec;
                  auVar163._8_4_ = fVar145 * fStack_4e8;
                  auVar163._12_4_ = fVar145 * fStack_4e4;
                  auVar140._4_4_ = fVar144;
                  auVar140._0_4_ = fVar144;
                  auVar140._8_4_ = fVar144;
                  auVar140._12_4_ = fVar144;
                  auVar66._8_8_ = uStack_5a8;
                  auVar66._0_8_ = local_5b0;
                  auVar84 = vfmadd132ps_fma(auVar140,auVar163,auVar66);
                  auVar154._4_4_ = fVar138;
                  auVar154._0_4_ = fVar138;
                  auVar154._8_4_ = fVar138;
                  auVar154._12_4_ = fVar138;
                  auVar68._8_8_ = uStack_598;
                  auVar68._0_8_ = local_5a0;
                  auVar84 = vfmadd132ps_fma(auVar154,auVar84,auVar68);
                  auVar141._4_4_ = fVar152;
                  auVar141._0_4_ = fVar152;
                  auVar141._8_4_ = fVar152;
                  auVar141._12_4_ = fVar152;
                  auVar84 = vfmadd213ps_fma(auVar141,auVar170._0_16_,auVar84);
                  local_330 = auVar84._0_4_;
                  local_320 = vshufps_avx(auVar84,auVar84,0x55);
                  local_310 = vshufps_avx(auVar84,auVar84,0xaa);
                  local_2e0 = local_390._0_8_;
                  uStack_2d8 = local_390._8_8_;
                  local_2d0 = local_510;
                  vpcmpeqd_avx2(ZEXT1632(local_510),ZEXT1632(local_510));
                  uStack_2bc = (local_570.context)->instID[0];
                  local_2c0 = uStack_2bc;
                  uStack_2b8 = uStack_2bc;
                  uStack_2b4 = uStack_2bc;
                  uStack_2b0 = (local_570.context)->instPrimID[0];
                  uStack_2ac = uStack_2b0;
                  uStack_2a8 = uStack_2b0;
                  uStack_2a4 = uStack_2b0;
                  local_5e0 = local_3a0;
                  local_570.valid = (int *)local_5e0;
                  local_570.geometryUserPtr = pGVar14->userPtr;
                  local_570.hit = (RTCHitN *)&local_330;
                  local_570.N = 4;
                  local_360 = (uint)uVar75;
                  uStack_35c = (uint)(uVar75 >> 0x20);
                  local_570.ray = (RTCRayN *)ray;
                  uStack_32c = local_330;
                  uStack_328 = local_330;
                  uStack_324 = local_330;
                  fStack_2fc = local_300;
                  fStack_2f8 = local_300;
                  fStack_2f4 = local_300;
                  uStack_2ec = local_2f0;
                  uStack_2e8 = local_2f0;
                  uStack_2e4 = local_2f0;
                  if (pGVar14->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar14->occlusionFilterN)(&local_570);
                    uVar75 = CONCAT44(uStack_35c,local_360);
                    auVar181 = ZEXT1664(local_590);
                    auVar192 = ZEXT3264(local_4c0);
                    auVar191 = ZEXT3264(local_4a0);
                    auVar190 = ZEXT3264(local_4e0);
                    auVar185 = ZEXT3264(local_540);
                    auVar194 = ZEXT3264(local_400);
                    auVar189 = ZEXT3264(local_420);
                    auVar188 = ZEXT3264(local_3e0);
                    auVar187 = ZEXT3264(local_3c0);
                    auVar170 = ZEXT1664(local_5c0);
                    auVar85 = vxorps_avx512vl(auVar85,auVar85);
                    auVar186 = ZEXT1664(auVar85);
                    auVar97 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                    auVar193 = ZEXT3264(auVar97);
                    uVar173 = local_440._0_4_;
                  }
                  auVar85 = auVar186._0_16_;
                  uVar80 = vptestmd_avx512vl(local_5e0,local_5e0);
                  if ((uVar80 & 0xf) != 0) {
                    p_Var15 = context->args->filter;
                    if ((p_Var15 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar14->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var15)(&local_570);
                      uVar75 = CONCAT44(uStack_35c,local_360);
                      auVar181 = ZEXT1664(local_590);
                      auVar192 = ZEXT3264(local_4c0);
                      auVar191 = ZEXT3264(local_4a0);
                      auVar190 = ZEXT3264(local_4e0);
                      auVar185 = ZEXT3264(local_540);
                      auVar194 = ZEXT3264(local_400);
                      auVar189 = ZEXT3264(local_420);
                      auVar188 = ZEXT3264(local_3e0);
                      auVar187 = ZEXT3264(local_3c0);
                      auVar170 = ZEXT1664(local_5c0);
                      auVar85 = vxorps_avx512vl(auVar85,auVar85);
                      auVar186 = ZEXT1664(auVar85);
                      auVar97 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                      auVar193 = ZEXT3264(auVar97);
                      uVar173 = local_440._0_4_;
                    }
                    auVar85 = *(undefined1 (*) [16])(local_570.ray + 0x80);
                    uVar80 = vptestmd_avx512vl(local_5e0,local_5e0);
                    uVar80 = uVar80 & 0xf;
                    auVar84 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                    bVar76 = (bool)((byte)uVar80 & 1);
                    auVar88._0_4_ = (uint)bVar76 * auVar84._0_4_ | (uint)!bVar76 * auVar85._0_4_;
                    bVar76 = (bool)((byte)(uVar80 >> 1) & 1);
                    auVar88._4_4_ = (uint)bVar76 * auVar84._4_4_ | (uint)!bVar76 * auVar85._4_4_;
                    bVar76 = (bool)((byte)(uVar80 >> 2) & 1);
                    auVar88._8_4_ = (uint)bVar76 * auVar84._8_4_ | (uint)!bVar76 * auVar85._8_4_;
                    bVar76 = SUB81(uVar80 >> 3,0);
                    auVar88._12_4_ = (uint)bVar76 * auVar84._12_4_ | (uint)!bVar76 * auVar85._12_4_;
                    *(undefined1 (*) [16])(local_570.ray + 0x80) = auVar88;
                    if ((byte)uVar80 != 0) {
                      bVar76 = true;
                      local_2a0 = auVar181._0_4_;
                      goto LAB_01a8a83e;
                    }
                  }
                  *(float *)(ray + k * 4 + 0x80) = local_380;
                  lVar73 = 0;
                  uVar75 = uVar75 ^ 1L << ((ulong)(uint)local_2a0 & 0x3f);
                  for (uVar80 = uVar75; (uVar80 & 1) == 0; uVar80 = uVar80 >> 1 | 0x8000000000000000
                      ) {
                    lVar73 = lVar73 + 1;
                  }
                }
              }
            }
          }
          bVar76 = false;
        }
      }
    }
LAB_01a8a83e:
    if (8 < iVar13) {
      local_440 = vpbroadcastd_avx512vl();
      local_380 = 1.0 / (float)local_500._0_4_;
      local_500 = vpbroadcastd_avx512vl();
      fStack_37c = local_380;
      fStack_378 = local_380;
      fStack_374 = local_380;
      fStack_370 = local_380;
      fStack_36c = local_380;
      fStack_368 = local_380;
      fStack_364 = local_380;
      local_360 = uVar173;
      uStack_35c = uVar173;
      uStack_358 = uVar173;
      uStack_354 = uVar173;
      uStack_350 = uVar173;
      uStack_34c = uVar173;
      uStack_348 = uVar173;
      uStack_344 = uVar173;
      fStack_29c = local_2a0;
      fStack_298 = local_2a0;
      fStack_294 = local_2a0;
      fStack_290 = local_2a0;
      fStack_28c = local_2a0;
      fStack_288 = local_2a0;
      fStack_284 = local_2a0;
      for (lVar73 = 8; lVar73 < iVar13; lVar73 = lVar73 + 8) {
        auVar97 = vpbroadcastd_avx512vl();
        auVar99 = vpor_avx2(auVar97,_DAT_01fb4ba0);
        uVar24 = vpcmpd_avx512vl(auVar99,local_440,1);
        auVar97 = *(undefined1 (*) [32])(bezier_basis0 + lVar73 * 4 + lVar78);
        auVar94 = *(undefined1 (*) [32])(lVar78 + 0x21fb768 + lVar73 * 4);
        auVar95 = *(undefined1 (*) [32])(lVar78 + 0x21fbbec + lVar73 * 4);
        auVar96 = *(undefined1 (*) [32])(lVar78 + 0x21fc070 + lVar73 * 4);
        local_4a0 = auVar191._0_32_;
        auVar98 = vmulps_avx512vl(local_4a0,auVar96);
        local_4c0 = auVar192._0_32_;
        auVar108 = vmulps_avx512vl(local_4c0,auVar96);
        auVar48._4_4_ = auVar96._4_4_ * (float)local_100._4_4_;
        auVar48._0_4_ = auVar96._0_4_ * (float)local_100._0_4_;
        auVar48._8_4_ = auVar96._8_4_ * fStack_f8;
        auVar48._12_4_ = auVar96._12_4_ * fStack_f4;
        auVar48._16_4_ = auVar96._16_4_ * fStack_f0;
        auVar48._20_4_ = auVar96._20_4_ * fStack_ec;
        auVar48._24_4_ = auVar96._24_4_ * fStack_e8;
        auVar48._28_4_ = auVar99._28_4_;
        auVar106 = auVar185._0_32_;
        auVar99 = vfmadd231ps_avx512vl(auVar98,auVar95,auVar106);
        local_4e0 = auVar190._0_32_;
        auVar98 = vfmadd231ps_avx512vl(auVar108,auVar95,local_4e0);
        auVar108 = vfmadd231ps_avx512vl(auVar48,auVar95,local_e0);
        auVar165 = auVar189._0_32_;
        auVar99 = vfmadd231ps_avx512vl(auVar99,auVar94,auVar165);
        local_400 = auVar194._0_32_;
        auVar98 = vfmadd231ps_avx512vl(auVar98,auVar94,local_400);
        auVar85 = vfmadd231ps_fma(auVar108,auVar94,local_c0);
        local_3c0 = auVar187._0_32_;
        auVar102 = vfmadd231ps_avx512vl(auVar99,auVar97,local_3c0);
        local_3e0 = auVar188._0_32_;
        auVar93 = vfmadd231ps_avx512vl(auVar98,auVar97,local_3e0);
        auVar99 = *(undefined1 (*) [32])(bezier_basis1 + lVar73 * 4 + lVar78);
        auVar98 = *(undefined1 (*) [32])(lVar78 + 0x21fdb88 + lVar73 * 4);
        auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar97,local_a0);
        auVar108 = *(undefined1 (*) [32])(lVar78 + 0x21fe00c + lVar73 * 4);
        auVar107 = *(undefined1 (*) [32])(lVar78 + 0x21fe490 + lVar73 * 4);
        auVar100 = vmulps_avx512vl(local_4a0,auVar107);
        auVar101 = vmulps_avx512vl(local_4c0,auVar107);
        auVar49._4_4_ = auVar107._4_4_ * (float)local_100._4_4_;
        auVar49._0_4_ = auVar107._0_4_ * (float)local_100._0_4_;
        auVar49._8_4_ = auVar107._8_4_ * fStack_f8;
        auVar49._12_4_ = auVar107._12_4_ * fStack_f4;
        auVar49._16_4_ = auVar107._16_4_ * fStack_f0;
        auVar49._20_4_ = auVar107._20_4_ * fStack_ec;
        auVar49._24_4_ = auVar107._24_4_ * fStack_e8;
        auVar49._28_4_ = uStack_e4;
        auVar100 = vfmadd231ps_avx512vl(auVar100,auVar108,auVar106);
        auVar101 = vfmadd231ps_avx512vl(auVar101,auVar108,local_4e0);
        auVar91 = vfmadd231ps_avx512vl(auVar49,auVar108,local_e0);
        auVar100 = vfmadd231ps_avx512vl(auVar100,auVar98,auVar165);
        auVar101 = vfmadd231ps_avx512vl(auVar101,auVar98,local_400);
        auVar84 = vfmadd231ps_fma(auVar91,auVar98,local_c0);
        auVar91 = vfmadd231ps_avx512vl(auVar100,auVar99,local_3c0);
        auVar92 = vfmadd231ps_avx512vl(auVar101,auVar99,local_3e0);
        auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),auVar99,local_a0);
        auVar103 = vmaxps_avx512vl(ZEXT1632(auVar85),ZEXT1632(auVar84));
        auVar100 = vsubps_avx(auVar91,auVar102);
        auVar101 = vsubps_avx(auVar92,auVar93);
        auVar104 = vmulps_avx512vl(auVar93,auVar100);
        auVar105 = vmulps_avx512vl(auVar102,auVar101);
        auVar104 = vsubps_avx512vl(auVar104,auVar105);
        auVar105 = vmulps_avx512vl(auVar101,auVar101);
        auVar105 = vfmadd231ps_avx512vl(auVar105,auVar100,auVar100);
        auVar103 = vmulps_avx512vl(auVar103,auVar103);
        auVar103 = vmulps_avx512vl(auVar103,auVar105);
        auVar104 = vmulps_avx512vl(auVar104,auVar104);
        uVar146 = vcmpps_avx512vl(auVar104,auVar103,2);
        bVar79 = (byte)uVar24 & (byte)uVar146;
        if (bVar79 == 0) {
          auVar194 = ZEXT3264(local_400);
          auVar185 = ZEXT3264(auVar106);
        }
        else {
          auVar107 = vmulps_avx512vl(local_480,auVar107);
          auVar108 = vfmadd213ps_avx512vl(auVar108,local_160,auVar107);
          auVar98 = vfmadd213ps_avx512vl(auVar98,local_140,auVar108);
          auVar99 = vfmadd213ps_avx512vl(auVar99,local_120,auVar98);
          auVar96 = vmulps_avx512vl(local_480,auVar96);
          auVar95 = vfmadd213ps_avx512vl(auVar95,local_160,auVar96);
          auVar94 = vfmadd213ps_avx512vl(auVar94,local_140,auVar95);
          auVar98 = vfmadd213ps_avx512vl(auVar97,local_120,auVar94);
          auVar97 = *(undefined1 (*) [32])(lVar78 + 0x21fc4f4 + lVar73 * 4);
          auVar94 = *(undefined1 (*) [32])(lVar78 + 0x21fc978 + lVar73 * 4);
          auVar95 = *(undefined1 (*) [32])(lVar78 + 0x21fcdfc + lVar73 * 4);
          auVar96 = *(undefined1 (*) [32])(lVar78 + 0x21fd280 + lVar73 * 4);
          auVar108 = vmulps_avx512vl(local_4a0,auVar96);
          auVar107 = vmulps_avx512vl(local_4c0,auVar96);
          auVar96 = vmulps_avx512vl(local_480,auVar96);
          auVar108 = vfmadd231ps_avx512vl(auVar108,auVar95,auVar106);
          auVar107 = vfmadd231ps_avx512vl(auVar107,auVar95,local_4e0);
          auVar95 = vfmadd231ps_avx512vl(auVar96,local_160,auVar95);
          auVar96 = vfmadd231ps_avx512vl(auVar108,auVar94,auVar165);
          auVar108 = vfmadd231ps_avx512vl(auVar107,auVar94,local_400);
          auVar94 = vfmadd231ps_avx512vl(auVar95,local_140,auVar94);
          auVar96 = vfmadd231ps_avx512vl(auVar96,auVar97,local_3c0);
          auVar108 = vfmadd231ps_avx512vl(auVar108,auVar97,local_3e0);
          auVar107 = vfmadd231ps_avx512vl(auVar94,local_120,auVar97);
          auVar97 = *(undefined1 (*) [32])(lVar78 + 0x21fe914 + lVar73 * 4);
          auVar94 = *(undefined1 (*) [32])(lVar78 + 0x21ff21c + lVar73 * 4);
          auVar95 = *(undefined1 (*) [32])(lVar78 + 0x21ff6a0 + lVar73 * 4);
          auVar103 = vmulps_avx512vl(local_4a0,auVar95);
          auVar104 = vmulps_avx512vl(local_4c0,auVar95);
          auVar95 = vmulps_avx512vl(local_480,auVar95);
          auVar103 = vfmadd231ps_avx512vl(auVar103,auVar94,auVar106);
          auVar104 = vfmadd231ps_avx512vl(auVar104,auVar94,local_4e0);
          auVar95 = vfmadd231ps_avx512vl(auVar95,local_160,auVar94);
          auVar94 = *(undefined1 (*) [32])(lVar78 + 0x21fed98 + lVar73 * 4);
          auVar103 = vfmadd231ps_avx512vl(auVar103,auVar94,auVar165);
          auVar104 = vfmadd231ps_avx512vl(auVar104,auVar94,local_400);
          auVar94 = vfmadd231ps_avx512vl(auVar95,local_140,auVar94);
          auVar95 = vfmadd231ps_avx512vl(auVar103,auVar97,local_3c0);
          auVar103 = vfmadd231ps_avx512vl(auVar104,auVar97,local_3e0);
          auVar94 = vfmadd231ps_avx512vl(auVar94,local_120,auVar97);
          auVar104 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          vandps_avx512vl(auVar96,auVar104);
          vandps_avx512vl(auVar108,auVar104);
          auVar97 = vmaxps_avx(auVar104,auVar104);
          vandps_avx512vl(auVar107,auVar104);
          auVar97 = vmaxps_avx(auVar97,auVar104);
          auVar71._4_4_ = fStack_29c;
          auVar71._0_4_ = local_2a0;
          auVar71._8_4_ = fStack_298;
          auVar71._12_4_ = fStack_294;
          auVar71._16_4_ = fStack_290;
          auVar71._20_4_ = fStack_28c;
          auVar71._24_4_ = fStack_288;
          auVar71._28_4_ = fStack_284;
          uVar80 = vcmpps_avx512vl(auVar97,auVar71,1);
          bVar16 = (bool)((byte)uVar80 & 1);
          auVar120._0_4_ = (float)((uint)bVar16 * auVar100._0_4_ | (uint)!bVar16 * auVar96._0_4_);
          bVar16 = (bool)((byte)(uVar80 >> 1) & 1);
          auVar120._4_4_ = (float)((uint)bVar16 * auVar100._4_4_ | (uint)!bVar16 * auVar96._4_4_);
          bVar16 = (bool)((byte)(uVar80 >> 2) & 1);
          auVar120._8_4_ = (float)((uint)bVar16 * auVar100._8_4_ | (uint)!bVar16 * auVar96._8_4_);
          bVar16 = (bool)((byte)(uVar80 >> 3) & 1);
          auVar120._12_4_ = (float)((uint)bVar16 * auVar100._12_4_ | (uint)!bVar16 * auVar96._12_4_)
          ;
          bVar16 = (bool)((byte)(uVar80 >> 4) & 1);
          auVar120._16_4_ = (float)((uint)bVar16 * auVar100._16_4_ | (uint)!bVar16 * auVar96._16_4_)
          ;
          bVar16 = (bool)((byte)(uVar80 >> 5) & 1);
          auVar120._20_4_ = (float)((uint)bVar16 * auVar100._20_4_ | (uint)!bVar16 * auVar96._20_4_)
          ;
          bVar16 = (bool)((byte)(uVar80 >> 6) & 1);
          auVar120._24_4_ = (float)((uint)bVar16 * auVar100._24_4_ | (uint)!bVar16 * auVar96._24_4_)
          ;
          bVar16 = SUB81(uVar80 >> 7,0);
          auVar120._28_4_ = (uint)bVar16 * auVar100._28_4_ | (uint)!bVar16 * auVar96._28_4_;
          bVar16 = (bool)((byte)uVar80 & 1);
          auVar121._0_4_ = (float)((uint)bVar16 * auVar101._0_4_ | (uint)!bVar16 * auVar108._0_4_);
          bVar16 = (bool)((byte)(uVar80 >> 1) & 1);
          auVar121._4_4_ = (float)((uint)bVar16 * auVar101._4_4_ | (uint)!bVar16 * auVar108._4_4_);
          bVar16 = (bool)((byte)(uVar80 >> 2) & 1);
          auVar121._8_4_ = (float)((uint)bVar16 * auVar101._8_4_ | (uint)!bVar16 * auVar108._8_4_);
          bVar16 = (bool)((byte)(uVar80 >> 3) & 1);
          auVar121._12_4_ =
               (float)((uint)bVar16 * auVar101._12_4_ | (uint)!bVar16 * auVar108._12_4_);
          bVar16 = (bool)((byte)(uVar80 >> 4) & 1);
          auVar121._16_4_ =
               (float)((uint)bVar16 * auVar101._16_4_ | (uint)!bVar16 * auVar108._16_4_);
          bVar16 = (bool)((byte)(uVar80 >> 5) & 1);
          auVar121._20_4_ =
               (float)((uint)bVar16 * auVar101._20_4_ | (uint)!bVar16 * auVar108._20_4_);
          bVar16 = (bool)((byte)(uVar80 >> 6) & 1);
          auVar121._24_4_ =
               (float)((uint)bVar16 * auVar101._24_4_ | (uint)!bVar16 * auVar108._24_4_);
          bVar16 = SUB81(uVar80 >> 7,0);
          auVar121._28_4_ = (uint)bVar16 * auVar101._28_4_ | (uint)!bVar16 * auVar108._28_4_;
          vandps_avx512vl(auVar95,auVar104);
          vandps_avx512vl(auVar103,auVar104);
          auVar97 = vmaxps_avx(auVar121,auVar121);
          vandps_avx512vl(auVar94,auVar104);
          auVar97 = vmaxps_avx(auVar97,auVar121);
          uVar80 = vcmpps_avx512vl(auVar97,auVar71,1);
          bVar16 = (bool)((byte)uVar80 & 1);
          auVar122._0_4_ = (uint)bVar16 * auVar100._0_4_ | (uint)!bVar16 * auVar95._0_4_;
          bVar16 = (bool)((byte)(uVar80 >> 1) & 1);
          auVar122._4_4_ = (uint)bVar16 * auVar100._4_4_ | (uint)!bVar16 * auVar95._4_4_;
          bVar16 = (bool)((byte)(uVar80 >> 2) & 1);
          auVar122._8_4_ = (uint)bVar16 * auVar100._8_4_ | (uint)!bVar16 * auVar95._8_4_;
          bVar16 = (bool)((byte)(uVar80 >> 3) & 1);
          auVar122._12_4_ = (uint)bVar16 * auVar100._12_4_ | (uint)!bVar16 * auVar95._12_4_;
          bVar16 = (bool)((byte)(uVar80 >> 4) & 1);
          auVar122._16_4_ = (uint)bVar16 * auVar100._16_4_ | (uint)!bVar16 * auVar95._16_4_;
          bVar16 = (bool)((byte)(uVar80 >> 5) & 1);
          auVar122._20_4_ = (uint)bVar16 * auVar100._20_4_ | (uint)!bVar16 * auVar95._20_4_;
          bVar16 = (bool)((byte)(uVar80 >> 6) & 1);
          auVar122._24_4_ = (uint)bVar16 * auVar100._24_4_ | (uint)!bVar16 * auVar95._24_4_;
          bVar16 = SUB81(uVar80 >> 7,0);
          auVar122._28_4_ = (uint)bVar16 * auVar100._28_4_ | (uint)!bVar16 * auVar95._28_4_;
          bVar16 = (bool)((byte)uVar80 & 1);
          auVar123._0_4_ = (float)((uint)bVar16 * auVar101._0_4_ | (uint)!bVar16 * auVar103._0_4_);
          bVar16 = (bool)((byte)(uVar80 >> 1) & 1);
          auVar123._4_4_ = (float)((uint)bVar16 * auVar101._4_4_ | (uint)!bVar16 * auVar103._4_4_);
          bVar16 = (bool)((byte)(uVar80 >> 2) & 1);
          auVar123._8_4_ = (float)((uint)bVar16 * auVar101._8_4_ | (uint)!bVar16 * auVar103._8_4_);
          bVar16 = (bool)((byte)(uVar80 >> 3) & 1);
          auVar123._12_4_ =
               (float)((uint)bVar16 * auVar101._12_4_ | (uint)!bVar16 * auVar103._12_4_);
          bVar16 = (bool)((byte)(uVar80 >> 4) & 1);
          auVar123._16_4_ =
               (float)((uint)bVar16 * auVar101._16_4_ | (uint)!bVar16 * auVar103._16_4_);
          bVar16 = (bool)((byte)(uVar80 >> 5) & 1);
          auVar123._20_4_ =
               (float)((uint)bVar16 * auVar101._20_4_ | (uint)!bVar16 * auVar103._20_4_);
          bVar16 = (bool)((byte)(uVar80 >> 6) & 1);
          auVar123._24_4_ =
               (float)((uint)bVar16 * auVar101._24_4_ | (uint)!bVar16 * auVar103._24_4_);
          bVar16 = SUB81(uVar80 >> 7,0);
          auVar123._28_4_ = (uint)bVar16 * auVar101._28_4_ | (uint)!bVar16 * auVar103._28_4_;
          auVar175._8_4_ = 0x80000000;
          auVar175._0_8_ = 0x8000000080000000;
          auVar175._12_4_ = 0x80000000;
          auVar175._16_4_ = 0x80000000;
          auVar175._20_4_ = 0x80000000;
          auVar175._24_4_ = 0x80000000;
          auVar175._28_4_ = 0x80000000;
          auVar97 = vxorps_avx512vl(auVar122,auVar175);
          auVar103 = auVar186._0_32_;
          auVar94 = vfmadd213ps_avx512vl(auVar120,auVar120,auVar103);
          auVar89 = vfmadd231ps_fma(auVar94,auVar121,auVar121);
          auVar94 = vrsqrt14ps_avx512vl(ZEXT1632(auVar89));
          auVar184._8_4_ = 0xbf000000;
          auVar184._0_8_ = 0xbf000000bf000000;
          auVar184._12_4_ = 0xbf000000;
          auVar184._16_4_ = 0xbf000000;
          auVar184._20_4_ = 0xbf000000;
          auVar184._24_4_ = 0xbf000000;
          auVar184._28_4_ = 0xbf000000;
          fVar152 = auVar94._0_4_;
          fVar138 = auVar94._4_4_;
          fVar144 = auVar94._8_4_;
          fVar145 = auVar94._12_4_;
          fVar166 = auVar94._16_4_;
          fVar167 = auVar94._20_4_;
          fVar81 = auVar94._24_4_;
          auVar50._4_4_ = fVar138 * fVar138 * fVar138 * auVar89._4_4_ * -0.5;
          auVar50._0_4_ = fVar152 * fVar152 * fVar152 * auVar89._0_4_ * -0.5;
          auVar50._8_4_ = fVar144 * fVar144 * fVar144 * auVar89._8_4_ * -0.5;
          auVar50._12_4_ = fVar145 * fVar145 * fVar145 * auVar89._12_4_ * -0.5;
          auVar50._16_4_ = fVar166 * fVar166 * fVar166 * -0.0;
          auVar50._20_4_ = fVar167 * fVar167 * fVar167 * -0.0;
          auVar50._24_4_ = fVar81 * fVar81 * fVar81 * -0.0;
          auVar50._28_4_ = auVar121._28_4_;
          auVar95 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
          auVar94 = vfmadd231ps_avx512vl(auVar50,auVar95,auVar94);
          auVar51._4_4_ = auVar121._4_4_ * auVar94._4_4_;
          auVar51._0_4_ = auVar121._0_4_ * auVar94._0_4_;
          auVar51._8_4_ = auVar121._8_4_ * auVar94._8_4_;
          auVar51._12_4_ = auVar121._12_4_ * auVar94._12_4_;
          auVar51._16_4_ = auVar121._16_4_ * auVar94._16_4_;
          auVar51._20_4_ = auVar121._20_4_ * auVar94._20_4_;
          auVar51._24_4_ = auVar121._24_4_ * auVar94._24_4_;
          auVar51._28_4_ = 0;
          auVar52._4_4_ = auVar94._4_4_ * -auVar120._4_4_;
          auVar52._0_4_ = auVar94._0_4_ * -auVar120._0_4_;
          auVar52._8_4_ = auVar94._8_4_ * -auVar120._8_4_;
          auVar52._12_4_ = auVar94._12_4_ * -auVar120._12_4_;
          auVar52._16_4_ = auVar94._16_4_ * -auVar120._16_4_;
          auVar52._20_4_ = auVar94._20_4_ * -auVar120._20_4_;
          auVar52._24_4_ = auVar94._24_4_ * -auVar120._24_4_;
          auVar52._28_4_ = auVar121._28_4_;
          auVar96 = vmulps_avx512vl(auVar94,auVar103);
          auVar94 = vfmadd213ps_avx512vl(auVar122,auVar122,auVar103);
          auVar94 = vfmadd231ps_avx512vl(auVar94,auVar123,auVar123);
          auVar108 = vrsqrt14ps_avx512vl(auVar94);
          auVar94 = vmulps_avx512vl(auVar94,auVar184);
          fVar152 = auVar108._0_4_;
          fVar138 = auVar108._4_4_;
          fVar144 = auVar108._8_4_;
          fVar145 = auVar108._12_4_;
          fVar166 = auVar108._16_4_;
          fVar167 = auVar108._20_4_;
          fVar81 = auVar108._24_4_;
          auVar53._4_4_ = fVar138 * fVar138 * fVar138 * auVar94._4_4_;
          auVar53._0_4_ = fVar152 * fVar152 * fVar152 * auVar94._0_4_;
          auVar53._8_4_ = fVar144 * fVar144 * fVar144 * auVar94._8_4_;
          auVar53._12_4_ = fVar145 * fVar145 * fVar145 * auVar94._12_4_;
          auVar53._16_4_ = fVar166 * fVar166 * fVar166 * auVar94._16_4_;
          auVar53._20_4_ = fVar167 * fVar167 * fVar167 * auVar94._20_4_;
          auVar53._24_4_ = fVar81 * fVar81 * fVar81 * auVar94._24_4_;
          auVar53._28_4_ = auVar94._28_4_;
          auVar94 = vfmadd231ps_avx512vl(auVar53,auVar95,auVar108);
          auVar54._4_4_ = auVar123._4_4_ * auVar94._4_4_;
          auVar54._0_4_ = auVar123._0_4_ * auVar94._0_4_;
          auVar54._8_4_ = auVar123._8_4_ * auVar94._8_4_;
          auVar54._12_4_ = auVar123._12_4_ * auVar94._12_4_;
          auVar54._16_4_ = auVar123._16_4_ * auVar94._16_4_;
          auVar54._20_4_ = auVar123._20_4_ * auVar94._20_4_;
          auVar54._24_4_ = auVar123._24_4_ * auVar94._24_4_;
          auVar54._28_4_ = auVar108._28_4_;
          auVar55._4_4_ = auVar94._4_4_ * auVar97._4_4_;
          auVar55._0_4_ = auVar94._0_4_ * auVar97._0_4_;
          auVar55._8_4_ = auVar94._8_4_ * auVar97._8_4_;
          auVar55._12_4_ = auVar94._12_4_ * auVar97._12_4_;
          auVar55._16_4_ = auVar94._16_4_ * auVar97._16_4_;
          auVar55._20_4_ = auVar94._20_4_ * auVar97._20_4_;
          auVar55._24_4_ = auVar94._24_4_ * auVar97._24_4_;
          auVar55._28_4_ = auVar97._28_4_;
          auVar97 = vmulps_avx512vl(auVar94,auVar103);
          auVar89 = vfmadd213ps_fma(auVar51,ZEXT1632(auVar85),auVar102);
          auVar94 = ZEXT1632(auVar85);
          auVar83 = vfmadd213ps_fma(auVar52,auVar94,auVar93);
          auVar95 = vfmadd213ps_avx512vl(auVar96,auVar94,auVar98);
          auVar108 = vfmadd213ps_avx512vl(auVar54,ZEXT1632(auVar84),auVar91);
          auVar86 = vfnmadd213ps_fma(auVar51,auVar94,auVar102);
          auVar107 = ZEXT1632(auVar84);
          auVar9 = vfmadd213ps_fma(auVar55,auVar107,auVar92);
          auVar22 = vfnmadd213ps_fma(auVar52,auVar94,auVar93);
          auVar10 = vfmadd213ps_fma(auVar97,auVar107,auVar99);
          auVar93 = ZEXT1632(auVar85);
          auVar149 = vfnmadd231ps_fma(auVar98,auVar93,auVar96);
          auVar23 = vfnmadd213ps_fma(auVar54,auVar107,auVar91);
          auVar148 = vfnmadd213ps_fma(auVar55,auVar107,auVar92);
          auVar87 = vfnmadd231ps_fma(auVar99,ZEXT1632(auVar84),auVar97);
          auVar99 = vsubps_avx512vl(auVar108,ZEXT1632(auVar86));
          auVar97 = vsubps_avx(ZEXT1632(auVar9),ZEXT1632(auVar22));
          auVar94 = vsubps_avx(ZEXT1632(auVar10),ZEXT1632(auVar149));
          auVar56._4_4_ = auVar97._4_4_ * auVar149._4_4_;
          auVar56._0_4_ = auVar97._0_4_ * auVar149._0_4_;
          auVar56._8_4_ = auVar97._8_4_ * auVar149._8_4_;
          auVar56._12_4_ = auVar97._12_4_ * auVar149._12_4_;
          auVar56._16_4_ = auVar97._16_4_ * 0.0;
          auVar56._20_4_ = auVar97._20_4_ * 0.0;
          auVar56._24_4_ = auVar97._24_4_ * 0.0;
          auVar56._28_4_ = auVar96._28_4_;
          auVar85 = vfmsub231ps_fma(auVar56,ZEXT1632(auVar22),auVar94);
          auVar57._4_4_ = auVar94._4_4_ * auVar86._4_4_;
          auVar57._0_4_ = auVar94._0_4_ * auVar86._0_4_;
          auVar57._8_4_ = auVar94._8_4_ * auVar86._8_4_;
          auVar57._12_4_ = auVar94._12_4_ * auVar86._12_4_;
          auVar57._16_4_ = auVar94._16_4_ * 0.0;
          auVar57._20_4_ = auVar94._20_4_ * 0.0;
          auVar57._24_4_ = auVar94._24_4_ * 0.0;
          auVar57._28_4_ = auVar94._28_4_;
          auVar11 = vfmsub231ps_fma(auVar57,ZEXT1632(auVar149),auVar99);
          auVar58._4_4_ = auVar22._4_4_ * auVar99._4_4_;
          auVar58._0_4_ = auVar22._0_4_ * auVar99._0_4_;
          auVar58._8_4_ = auVar22._8_4_ * auVar99._8_4_;
          auVar58._12_4_ = auVar22._12_4_ * auVar99._12_4_;
          auVar58._16_4_ = auVar99._16_4_ * 0.0;
          auVar58._20_4_ = auVar99._20_4_ * 0.0;
          auVar58._24_4_ = auVar99._24_4_ * 0.0;
          auVar58._28_4_ = auVar99._28_4_;
          auVar12 = vfmsub231ps_fma(auVar58,ZEXT1632(auVar86),auVar97);
          auVar97 = vfmadd231ps_avx512vl(ZEXT1632(auVar12),auVar103,ZEXT1632(auVar11));
          auVar97 = vfmadd231ps_avx512vl(auVar97,auVar103,ZEXT1632(auVar85));
          uVar80 = vcmpps_avx512vl(auVar97,auVar103,2);
          bVar72 = (byte)uVar80;
          fVar130 = (float)((uint)(bVar72 & 1) * auVar89._0_4_ |
                           (uint)!(bool)(bVar72 & 1) * auVar23._0_4_);
          bVar16 = (bool)((byte)(uVar80 >> 1) & 1);
          fVar132 = (float)((uint)bVar16 * auVar89._4_4_ | (uint)!bVar16 * auVar23._4_4_);
          bVar16 = (bool)((byte)(uVar80 >> 2) & 1);
          fVar135 = (float)((uint)bVar16 * auVar89._8_4_ | (uint)!bVar16 * auVar23._8_4_);
          bVar16 = (bool)((byte)(uVar80 >> 3) & 1);
          fVar136 = (float)((uint)bVar16 * auVar89._12_4_ | (uint)!bVar16 * auVar23._12_4_);
          auVar107 = ZEXT1632(CONCAT412(fVar136,CONCAT48(fVar135,CONCAT44(fVar132,fVar130))));
          fVar131 = (float)((uint)(bVar72 & 1) * auVar83._0_4_ |
                           (uint)!(bool)(bVar72 & 1) * auVar148._0_4_);
          bVar16 = (bool)((byte)(uVar80 >> 1) & 1);
          fVar134 = (float)((uint)bVar16 * auVar83._4_4_ | (uint)!bVar16 * auVar148._4_4_);
          bVar16 = (bool)((byte)(uVar80 >> 2) & 1);
          fVar133 = (float)((uint)bVar16 * auVar83._8_4_ | (uint)!bVar16 * auVar148._8_4_);
          bVar16 = (bool)((byte)(uVar80 >> 3) & 1);
          fVar137 = (float)((uint)bVar16 * auVar83._12_4_ | (uint)!bVar16 * auVar148._12_4_);
          auVar100 = ZEXT1632(CONCAT412(fVar137,CONCAT48(fVar133,CONCAT44(fVar134,fVar131))));
          auVar124._0_4_ =
               (float)((uint)(bVar72 & 1) * auVar95._0_4_ |
                      (uint)!(bool)(bVar72 & 1) * auVar87._0_4_);
          bVar16 = (bool)((byte)(uVar80 >> 1) & 1);
          auVar124._4_4_ = (float)((uint)bVar16 * auVar95._4_4_ | (uint)!bVar16 * auVar87._4_4_);
          bVar16 = (bool)((byte)(uVar80 >> 2) & 1);
          auVar124._8_4_ = (float)((uint)bVar16 * auVar95._8_4_ | (uint)!bVar16 * auVar87._8_4_);
          bVar16 = (bool)((byte)(uVar80 >> 3) & 1);
          auVar124._12_4_ = (float)((uint)bVar16 * auVar95._12_4_ | (uint)!bVar16 * auVar87._12_4_);
          fVar144 = (float)((uint)((byte)(uVar80 >> 4) & 1) * auVar95._16_4_);
          auVar124._16_4_ = fVar144;
          fVar138 = (float)((uint)((byte)(uVar80 >> 5) & 1) * auVar95._20_4_);
          auVar124._20_4_ = fVar138;
          fVar152 = (float)((uint)((byte)(uVar80 >> 6) & 1) * auVar95._24_4_);
          auVar124._24_4_ = fVar152;
          iVar2 = (uint)(byte)(uVar80 >> 7) * auVar95._28_4_;
          auVar124._28_4_ = iVar2;
          auVar97 = vblendmps_avx512vl(ZEXT1632(auVar86),auVar108);
          auVar125._0_4_ =
               (uint)(bVar72 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar72 & 1) * auVar85._0_4_;
          bVar16 = (bool)((byte)(uVar80 >> 1) & 1);
          auVar125._4_4_ = (uint)bVar16 * auVar97._4_4_ | (uint)!bVar16 * auVar85._4_4_;
          bVar16 = (bool)((byte)(uVar80 >> 2) & 1);
          auVar125._8_4_ = (uint)bVar16 * auVar97._8_4_ | (uint)!bVar16 * auVar85._8_4_;
          bVar16 = (bool)((byte)(uVar80 >> 3) & 1);
          auVar125._12_4_ = (uint)bVar16 * auVar97._12_4_ | (uint)!bVar16 * auVar85._12_4_;
          auVar125._16_4_ = (uint)((byte)(uVar80 >> 4) & 1) * auVar97._16_4_;
          auVar125._20_4_ = (uint)((byte)(uVar80 >> 5) & 1) * auVar97._20_4_;
          auVar125._24_4_ = (uint)((byte)(uVar80 >> 6) & 1) * auVar97._24_4_;
          auVar125._28_4_ = (uint)(byte)(uVar80 >> 7) * auVar97._28_4_;
          auVar97 = vblendmps_avx512vl(ZEXT1632(auVar22),ZEXT1632(auVar9));
          auVar126._0_4_ =
               (float)((uint)(bVar72 & 1) * auVar97._0_4_ |
                      (uint)!(bool)(bVar72 & 1) * auVar89._0_4_);
          bVar16 = (bool)((byte)(uVar80 >> 1) & 1);
          auVar126._4_4_ = (float)((uint)bVar16 * auVar97._4_4_ | (uint)!bVar16 * auVar89._4_4_);
          bVar16 = (bool)((byte)(uVar80 >> 2) & 1);
          auVar126._8_4_ = (float)((uint)bVar16 * auVar97._8_4_ | (uint)!bVar16 * auVar89._8_4_);
          bVar16 = (bool)((byte)(uVar80 >> 3) & 1);
          auVar126._12_4_ = (float)((uint)bVar16 * auVar97._12_4_ | (uint)!bVar16 * auVar89._12_4_);
          fVar167 = (float)((uint)((byte)(uVar80 >> 4) & 1) * auVar97._16_4_);
          auVar126._16_4_ = fVar167;
          fVar166 = (float)((uint)((byte)(uVar80 >> 5) & 1) * auVar97._20_4_);
          auVar126._20_4_ = fVar166;
          fVar145 = (float)((uint)((byte)(uVar80 >> 6) & 1) * auVar97._24_4_);
          auVar126._24_4_ = fVar145;
          auVar126._28_4_ = (uint)(byte)(uVar80 >> 7) * auVar97._28_4_;
          auVar97 = vblendmps_avx512vl(ZEXT1632(auVar149),ZEXT1632(auVar10));
          auVar127._0_4_ =
               (float)((uint)(bVar72 & 1) * auVar97._0_4_ |
                      (uint)!(bool)(bVar72 & 1) * auVar83._0_4_);
          bVar16 = (bool)((byte)(uVar80 >> 1) & 1);
          auVar127._4_4_ = (float)((uint)bVar16 * auVar97._4_4_ | (uint)!bVar16 * auVar83._4_4_);
          bVar16 = (bool)((byte)(uVar80 >> 2) & 1);
          auVar127._8_4_ = (float)((uint)bVar16 * auVar97._8_4_ | (uint)!bVar16 * auVar83._8_4_);
          bVar16 = (bool)((byte)(uVar80 >> 3) & 1);
          auVar127._12_4_ = (float)((uint)bVar16 * auVar97._12_4_ | (uint)!bVar16 * auVar83._12_4_);
          fVar81 = (float)((uint)((byte)(uVar80 >> 4) & 1) * auVar97._16_4_);
          auVar127._16_4_ = fVar81;
          fVar82 = (float)((uint)((byte)(uVar80 >> 5) & 1) * auVar97._20_4_);
          auVar127._20_4_ = fVar82;
          fVar151 = (float)((uint)((byte)(uVar80 >> 6) & 1) * auVar97._24_4_);
          auVar127._24_4_ = fVar151;
          iVar3 = (uint)(byte)(uVar80 >> 7) * auVar97._28_4_;
          auVar127._28_4_ = iVar3;
          auVar128._0_4_ =
               (uint)(bVar72 & 1) * (int)auVar86._0_4_ | (uint)!(bool)(bVar72 & 1) * auVar108._0_4_;
          bVar16 = (bool)((byte)(uVar80 >> 1) & 1);
          auVar128._4_4_ = (uint)bVar16 * (int)auVar86._4_4_ | (uint)!bVar16 * auVar108._4_4_;
          bVar16 = (bool)((byte)(uVar80 >> 2) & 1);
          auVar128._8_4_ = (uint)bVar16 * (int)auVar86._8_4_ | (uint)!bVar16 * auVar108._8_4_;
          bVar16 = (bool)((byte)(uVar80 >> 3) & 1);
          auVar128._12_4_ = (uint)bVar16 * (int)auVar86._12_4_ | (uint)!bVar16 * auVar108._12_4_;
          auVar128._16_4_ = (uint)!(bool)((byte)(uVar80 >> 4) & 1) * auVar108._16_4_;
          auVar128._20_4_ = (uint)!(bool)((byte)(uVar80 >> 5) & 1) * auVar108._20_4_;
          auVar128._24_4_ = (uint)!(bool)((byte)(uVar80 >> 6) & 1) * auVar108._24_4_;
          auVar128._28_4_ = (uint)!SUB81(uVar80 >> 7,0) * auVar108._28_4_;
          bVar16 = (bool)((byte)(uVar80 >> 1) & 1);
          bVar19 = (bool)((byte)(uVar80 >> 2) & 1);
          bVar20 = (bool)((byte)(uVar80 >> 3) & 1);
          bVar17 = (bool)((byte)(uVar80 >> 1) & 1);
          bVar18 = (bool)((byte)(uVar80 >> 2) & 1);
          bVar21 = (bool)((byte)(uVar80 >> 3) & 1);
          auVar108 = vsubps_avx512vl(auVar128,auVar107);
          auVar94 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar20 * (int)auVar22._12_4_ |
                                                  (uint)!bVar20 * auVar9._12_4_,
                                                  CONCAT48((uint)bVar19 * (int)auVar22._8_4_ |
                                                           (uint)!bVar19 * auVar9._8_4_,
                                                           CONCAT44((uint)bVar16 *
                                                                    (int)auVar22._4_4_ |
                                                                    (uint)!bVar16 * auVar9._4_4_,
                                                                    (uint)(bVar72 & 1) *
                                                                    (int)auVar22._0_4_ |
                                                                    (uint)!(bool)(bVar72 & 1) *
                                                                    auVar9._0_4_)))),auVar100);
          auVar95 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar21 * (int)auVar149._12_4_ |
                                                  (uint)!bVar21 * auVar10._12_4_,
                                                  CONCAT48((uint)bVar18 * (int)auVar149._8_4_ |
                                                           (uint)!bVar18 * auVar10._8_4_,
                                                           CONCAT44((uint)bVar17 *
                                                                    (int)auVar149._4_4_ |
                                                                    (uint)!bVar17 * auVar10._4_4_,
                                                                    (uint)(bVar72 & 1) *
                                                                    (int)auVar149._0_4_ |
                                                                    (uint)!(bool)(bVar72 & 1) *
                                                                    auVar10._0_4_)))),auVar124);
          auVar96 = vsubps_avx(auVar107,auVar125);
          auVar99 = vsubps_avx(auVar100,auVar126);
          auVar98 = vsubps_avx(auVar124,auVar127);
          auVar59._4_4_ = auVar95._4_4_ * fVar132;
          auVar59._0_4_ = auVar95._0_4_ * fVar130;
          auVar59._8_4_ = auVar95._8_4_ * fVar135;
          auVar59._12_4_ = auVar95._12_4_ * fVar136;
          auVar59._16_4_ = auVar95._16_4_ * 0.0;
          auVar59._20_4_ = auVar95._20_4_ * 0.0;
          auVar59._24_4_ = auVar95._24_4_ * 0.0;
          auVar59._28_4_ = 0;
          auVar85 = vfmsub231ps_fma(auVar59,auVar124,auVar108);
          auVar157._0_4_ = fVar131 * auVar108._0_4_;
          auVar157._4_4_ = fVar134 * auVar108._4_4_;
          auVar157._8_4_ = fVar133 * auVar108._8_4_;
          auVar157._12_4_ = fVar137 * auVar108._12_4_;
          auVar157._16_4_ = auVar108._16_4_ * 0.0;
          auVar157._20_4_ = auVar108._20_4_ * 0.0;
          auVar157._24_4_ = auVar108._24_4_ * 0.0;
          auVar157._28_4_ = 0;
          auVar89 = vfmsub231ps_fma(auVar157,auVar107,auVar94);
          auVar97 = vfmadd231ps_avx512vl(ZEXT1632(auVar89),auVar103,ZEXT1632(auVar85));
          auVar161._0_4_ = auVar94._0_4_ * auVar124._0_4_;
          auVar161._4_4_ = auVar94._4_4_ * auVar124._4_4_;
          auVar161._8_4_ = auVar94._8_4_ * auVar124._8_4_;
          auVar161._12_4_ = auVar94._12_4_ * auVar124._12_4_;
          auVar161._16_4_ = auVar94._16_4_ * fVar144;
          auVar161._20_4_ = auVar94._20_4_ * fVar138;
          auVar161._24_4_ = auVar94._24_4_ * fVar152;
          auVar161._28_4_ = 0;
          auVar85 = vfmsub231ps_fma(auVar161,auVar100,auVar95);
          auVar101 = vfmadd231ps_avx512vl(auVar97,auVar103,ZEXT1632(auVar85));
          auVar97 = vmulps_avx512vl(auVar98,auVar125);
          auVar97 = vfmsub231ps_avx512vl(auVar97,auVar96,auVar127);
          auVar60._4_4_ = auVar99._4_4_ * auVar127._4_4_;
          auVar60._0_4_ = auVar99._0_4_ * auVar127._0_4_;
          auVar60._8_4_ = auVar99._8_4_ * auVar127._8_4_;
          auVar60._12_4_ = auVar99._12_4_ * auVar127._12_4_;
          auVar60._16_4_ = auVar99._16_4_ * fVar81;
          auVar60._20_4_ = auVar99._20_4_ * fVar82;
          auVar60._24_4_ = auVar99._24_4_ * fVar151;
          auVar60._28_4_ = iVar3;
          auVar85 = vfmsub231ps_fma(auVar60,auVar126,auVar98);
          auVar162._0_4_ = auVar126._0_4_ * auVar96._0_4_;
          auVar162._4_4_ = auVar126._4_4_ * auVar96._4_4_;
          auVar162._8_4_ = auVar126._8_4_ * auVar96._8_4_;
          auVar162._12_4_ = auVar126._12_4_ * auVar96._12_4_;
          auVar162._16_4_ = fVar167 * auVar96._16_4_;
          auVar162._20_4_ = fVar166 * auVar96._20_4_;
          auVar162._24_4_ = fVar145 * auVar96._24_4_;
          auVar162._28_4_ = 0;
          auVar89 = vfmsub231ps_fma(auVar162,auVar99,auVar125);
          auVar97 = vfmadd231ps_avx512vl(ZEXT1632(auVar89),auVar103,auVar97);
          auVar102 = vfmadd231ps_avx512vl(auVar97,auVar103,ZEXT1632(auVar85));
          auVar97 = vmaxps_avx(auVar101,auVar102);
          uVar146 = vcmpps_avx512vl(auVar97,auVar103,2);
          bVar79 = bVar79 & (byte)uVar146;
          auVar194 = ZEXT3264(local_400);
          if (bVar79 != 0) {
            auVar61._4_4_ = auVar98._4_4_ * auVar94._4_4_;
            auVar61._0_4_ = auVar98._0_4_ * auVar94._0_4_;
            auVar61._8_4_ = auVar98._8_4_ * auVar94._8_4_;
            auVar61._12_4_ = auVar98._12_4_ * auVar94._12_4_;
            auVar61._16_4_ = auVar98._16_4_ * auVar94._16_4_;
            auVar61._20_4_ = auVar98._20_4_ * auVar94._20_4_;
            auVar61._24_4_ = auVar98._24_4_ * auVar94._24_4_;
            auVar61._28_4_ = auVar97._28_4_;
            auVar83 = vfmsub231ps_fma(auVar61,auVar99,auVar95);
            auVar62._4_4_ = auVar95._4_4_ * auVar96._4_4_;
            auVar62._0_4_ = auVar95._0_4_ * auVar96._0_4_;
            auVar62._8_4_ = auVar95._8_4_ * auVar96._8_4_;
            auVar62._12_4_ = auVar95._12_4_ * auVar96._12_4_;
            auVar62._16_4_ = auVar95._16_4_ * auVar96._16_4_;
            auVar62._20_4_ = auVar95._20_4_ * auVar96._20_4_;
            auVar62._24_4_ = auVar95._24_4_ * auVar96._24_4_;
            auVar62._28_4_ = auVar95._28_4_;
            auVar89 = vfmsub231ps_fma(auVar62,auVar108,auVar98);
            auVar63._4_4_ = auVar99._4_4_ * auVar108._4_4_;
            auVar63._0_4_ = auVar99._0_4_ * auVar108._0_4_;
            auVar63._8_4_ = auVar99._8_4_ * auVar108._8_4_;
            auVar63._12_4_ = auVar99._12_4_ * auVar108._12_4_;
            auVar63._16_4_ = auVar99._16_4_ * auVar108._16_4_;
            auVar63._20_4_ = auVar99._20_4_ * auVar108._20_4_;
            auVar63._24_4_ = auVar99._24_4_ * auVar108._24_4_;
            auVar63._28_4_ = auVar99._28_4_;
            auVar9 = vfmsub231ps_fma(auVar63,auVar96,auVar94);
            auVar85 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar89),ZEXT1632(auVar9));
            auVar97 = vfmadd231ps_avx512vl(ZEXT1632(auVar85),ZEXT1632(auVar83),auVar103);
            auVar94 = vrcp14ps_avx512vl(auVar97);
            auVar96 = auVar193._0_32_;
            auVar95 = vfnmadd213ps_avx512vl(auVar94,auVar97,auVar96);
            auVar85 = vfmadd132ps_fma(auVar95,auVar94,auVar94);
            auVar64._4_4_ = auVar9._4_4_ * auVar124._4_4_;
            auVar64._0_4_ = auVar9._0_4_ * auVar124._0_4_;
            auVar64._8_4_ = auVar9._8_4_ * auVar124._8_4_;
            auVar64._12_4_ = auVar9._12_4_ * auVar124._12_4_;
            auVar64._16_4_ = fVar144 * 0.0;
            auVar64._20_4_ = fVar138 * 0.0;
            auVar64._24_4_ = fVar152 * 0.0;
            auVar64._28_4_ = iVar2;
            auVar89 = vfmadd231ps_fma(auVar64,auVar100,ZEXT1632(auVar89));
            auVar89 = vfmadd231ps_fma(ZEXT1632(auVar89),auVar107,ZEXT1632(auVar83));
            fVar152 = auVar85._0_4_;
            fVar138 = auVar85._4_4_;
            fVar144 = auVar85._8_4_;
            fVar145 = auVar85._12_4_;
            local_240 = ZEXT1632(CONCAT412(auVar89._12_4_ * fVar145,
                                           CONCAT48(auVar89._8_4_ * fVar144,
                                                    CONCAT44(auVar89._4_4_ * fVar138,
                                                             auVar89._0_4_ * fVar152))));
            auVar70._4_4_ = uStack_35c;
            auVar70._0_4_ = local_360;
            auVar70._8_4_ = uStack_358;
            auVar70._12_4_ = uStack_354;
            auVar70._16_4_ = uStack_350;
            auVar70._20_4_ = uStack_34c;
            auVar70._24_4_ = uStack_348;
            auVar70._28_4_ = uStack_344;
            uVar146 = vcmpps_avx512vl(local_240,auVar70,0xd);
            uVar139 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar29._4_4_ = uVar139;
            auVar29._0_4_ = uVar139;
            auVar29._8_4_ = uVar139;
            auVar29._12_4_ = uVar139;
            auVar29._16_4_ = uVar139;
            auVar29._20_4_ = uVar139;
            auVar29._24_4_ = uVar139;
            auVar29._28_4_ = uVar139;
            uVar24 = vcmpps_avx512vl(local_240,auVar29,2);
            bVar79 = (byte)uVar146 & (byte)uVar24 & bVar79;
            if (bVar79 != 0) {
              uVar146 = vcmpps_avx512vl(auVar97,auVar103,4);
              bVar79 = bVar79 & (byte)uVar146;
              auVar181 = ZEXT1664(local_5c0);
              auVar185 = ZEXT3264(local_540);
              if (bVar79 != 0) {
                fVar166 = auVar101._0_4_ * fVar152;
                fVar167 = auVar101._4_4_ * fVar138;
                auVar65._4_4_ = fVar167;
                auVar65._0_4_ = fVar166;
                fVar81 = auVar101._8_4_ * fVar144;
                auVar65._8_4_ = fVar81;
                fVar82 = auVar101._12_4_ * fVar145;
                auVar65._12_4_ = fVar82;
                fVar151 = auVar101._16_4_ * 0.0;
                auVar65._16_4_ = fVar151;
                fVar130 = auVar101._20_4_ * 0.0;
                auVar65._20_4_ = fVar130;
                fVar131 = auVar101._24_4_ * 0.0;
                auVar65._24_4_ = fVar131;
                auVar65._28_4_ = auVar97._28_4_;
                auVar94 = vsubps_avx512vl(auVar96,auVar65);
                local_280._0_4_ =
                     (float)((uint)(bVar72 & 1) * (int)fVar166 |
                            (uint)!(bool)(bVar72 & 1) * auVar94._0_4_);
                bVar16 = (bool)((byte)(uVar80 >> 1) & 1);
                local_280._4_4_ =
                     (float)((uint)bVar16 * (int)fVar167 | (uint)!bVar16 * auVar94._4_4_);
                bVar16 = (bool)((byte)(uVar80 >> 2) & 1);
                local_280._8_4_ =
                     (float)((uint)bVar16 * (int)fVar81 | (uint)!bVar16 * auVar94._8_4_);
                bVar16 = (bool)((byte)(uVar80 >> 3) & 1);
                local_280._12_4_ =
                     (float)((uint)bVar16 * (int)fVar82 | (uint)!bVar16 * auVar94._12_4_);
                bVar16 = (bool)((byte)(uVar80 >> 4) & 1);
                local_280._16_4_ =
                     (float)((uint)bVar16 * (int)fVar151 | (uint)!bVar16 * auVar94._16_4_);
                bVar16 = (bool)((byte)(uVar80 >> 5) & 1);
                local_280._20_4_ =
                     (float)((uint)bVar16 * (int)fVar130 | (uint)!bVar16 * auVar94._20_4_);
                bVar16 = (bool)((byte)(uVar80 >> 6) & 1);
                local_280._24_4_ =
                     (float)((uint)bVar16 * (int)fVar131 | (uint)!bVar16 * auVar94._24_4_);
                bVar16 = SUB81(uVar80 >> 7,0);
                local_280._28_4_ =
                     (float)((uint)bVar16 * auVar97._28_4_ | (uint)!bVar16 * auVar94._28_4_);
                auVar97 = vsubps_avx(ZEXT1632(auVar84),auVar93);
                auVar85 = vfmadd213ps_fma(auVar97,local_280,auVar93);
                uVar139 = *(undefined4 *)((long)local_578->ray_space + k * 4 + -0x10);
                auVar30._4_4_ = uVar139;
                auVar30._0_4_ = uVar139;
                auVar30._8_4_ = uVar139;
                auVar30._12_4_ = uVar139;
                auVar30._16_4_ = uVar139;
                auVar30._20_4_ = uVar139;
                auVar30._24_4_ = uVar139;
                auVar30._28_4_ = uVar139;
                auVar97 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar85._12_4_ + auVar85._12_4_,
                                                             CONCAT48(auVar85._8_4_ + auVar85._8_4_,
                                                                      CONCAT44(auVar85._4_4_ +
                                                                               auVar85._4_4_,
                                                                               auVar85._0_4_ +
                                                                               auVar85._0_4_)))),
                                          auVar30);
                uVar146 = vcmpps_avx512vl(local_240,auVar97,6);
                if (((byte)uVar146 & bVar79) != 0) {
                  auVar147._0_4_ = auVar102._0_4_ * fVar152;
                  auVar147._4_4_ = auVar102._4_4_ * fVar138;
                  auVar147._8_4_ = auVar102._8_4_ * fVar144;
                  auVar147._12_4_ = auVar102._12_4_ * fVar145;
                  auVar147._16_4_ = auVar102._16_4_ * 0.0;
                  auVar147._20_4_ = auVar102._20_4_ * 0.0;
                  auVar147._24_4_ = auVar102._24_4_ * 0.0;
                  auVar147._28_4_ = 0;
                  auVar97 = vsubps_avx512vl(auVar96,auVar147);
                  auVar129._0_4_ =
                       (uint)(bVar72 & 1) * (int)auVar147._0_4_ |
                       (uint)!(bool)(bVar72 & 1) * auVar97._0_4_;
                  bVar16 = (bool)((byte)(uVar80 >> 1) & 1);
                  auVar129._4_4_ =
                       (uint)bVar16 * (int)auVar147._4_4_ | (uint)!bVar16 * auVar97._4_4_;
                  bVar16 = (bool)((byte)(uVar80 >> 2) & 1);
                  auVar129._8_4_ =
                       (uint)bVar16 * (int)auVar147._8_4_ | (uint)!bVar16 * auVar97._8_4_;
                  bVar16 = (bool)((byte)(uVar80 >> 3) & 1);
                  auVar129._12_4_ =
                       (uint)bVar16 * (int)auVar147._12_4_ | (uint)!bVar16 * auVar97._12_4_;
                  bVar16 = (bool)((byte)(uVar80 >> 4) & 1);
                  auVar129._16_4_ =
                       (uint)bVar16 * (int)auVar147._16_4_ | (uint)!bVar16 * auVar97._16_4_;
                  bVar16 = (bool)((byte)(uVar80 >> 5) & 1);
                  auVar129._20_4_ =
                       (uint)bVar16 * (int)auVar147._20_4_ | (uint)!bVar16 * auVar97._20_4_;
                  bVar16 = (bool)((byte)(uVar80 >> 6) & 1);
                  auVar129._24_4_ =
                       (uint)bVar16 * (int)auVar147._24_4_ | (uint)!bVar16 * auVar97._24_4_;
                  auVar129._28_4_ = (uint)!SUB81(uVar80 >> 7,0) * auVar97._28_4_;
                  auVar31._8_4_ = 0x40000000;
                  auVar31._0_8_ = 0x4000000040000000;
                  auVar31._12_4_ = 0x40000000;
                  auVar31._16_4_ = 0x40000000;
                  auVar31._20_4_ = 0x40000000;
                  auVar31._24_4_ = 0x40000000;
                  auVar31._28_4_ = 0x40000000;
                  local_260 = vfmsub132ps_avx512vl(auVar129,auVar96,auVar31);
                  local_220 = (undefined4)lVar73;
                  local_210 = local_5c0;
                  local_200 = local_5a0;
                  uStack_1f8 = uStack_598;
                  local_1f0 = local_5b0;
                  uStack_1e8 = uStack_5a8;
                  pGVar14 = (context->scene->geometries).items[local_5c8].ptr;
                  if ((pGVar14->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                    bVar72 = 0;
                  }
                  else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                          (bVar72 = 1, pGVar14->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    auVar85 = vcvtsi2ss_avx512f(auVar104._0_16_,local_220);
                    fVar152 = auVar85._0_4_;
                    local_1c0[0] = (fVar152 + local_280._0_4_ + 0.0) * local_380;
                    local_1c0[1] = (fVar152 + local_280._4_4_ + 1.0) * fStack_37c;
                    local_1c0[2] = (fVar152 + local_280._8_4_ + 2.0) * fStack_378;
                    local_1c0[3] = (fVar152 + local_280._12_4_ + 3.0) * fStack_374;
                    fStack_1b0 = (fVar152 + local_280._16_4_ + 4.0) * fStack_370;
                    fStack_1ac = (fVar152 + local_280._20_4_ + 5.0) * fStack_36c;
                    fStack_1a8 = (fVar152 + local_280._24_4_ + 6.0) * fStack_368;
                    fStack_1a4 = fVar152 + local_280._28_4_ + 7.0;
                    local_1a0 = local_260;
                    local_180 = local_240;
                    uVar80 = 0;
                    uVar74 = (ulong)((byte)uVar146 & bVar79);
                    for (uVar75 = uVar74; local_580 = pGVar14, local_21c = iVar13, (uVar75 & 1) == 0
                        ; uVar75 = uVar75 >> 1 | 0x8000000000000000) {
                      uVar80 = uVar80 + 1;
                    }
                    while (auVar85 = auVar186._0_16_, uVar74 != 0) {
                      uVar139 = *(undefined4 *)(ray + k * 4 + 0x80);
                      local_300 = local_1c0[uVar80];
                      local_2f0 = *(undefined4 *)(local_1a0 + uVar80 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_180 + uVar80 * 4);
                      local_570.context = context->user;
                      fVar138 = 1.0 - local_300;
                      fVar152 = fVar138 * fVar138 * -3.0;
                      auVar85 = vfmadd231ss_fma(ZEXT416((uint)(fVar138 * fVar138)),
                                                ZEXT416((uint)(local_300 * fVar138)),
                                                ZEXT416(0xc0000000));
                      auVar84 = vfmsub132ss_fma(ZEXT416((uint)(local_300 * fVar138)),
                                                ZEXT416((uint)(local_300 * local_300)),
                                                ZEXT416(0x40000000));
                      fVar138 = auVar85._0_4_ * 3.0;
                      fVar144 = auVar84._0_4_ * 3.0;
                      fVar145 = local_300 * local_300 * 3.0;
                      auVar164._0_4_ = fVar145 * local_4f0;
                      auVar164._4_4_ = fVar145 * fStack_4ec;
                      auVar164._8_4_ = fVar145 * fStack_4e8;
                      auVar164._12_4_ = fVar145 * fStack_4e4;
                      auVar142._4_4_ = fVar144;
                      auVar142._0_4_ = fVar144;
                      auVar142._8_4_ = fVar144;
                      auVar142._12_4_ = fVar144;
                      auVar67._8_8_ = uStack_5a8;
                      auVar67._0_8_ = local_5b0;
                      auVar85 = vfmadd132ps_fma(auVar142,auVar164,auVar67);
                      auVar155._4_4_ = fVar138;
                      auVar155._0_4_ = fVar138;
                      auVar155._8_4_ = fVar138;
                      auVar155._12_4_ = fVar138;
                      auVar69._8_8_ = uStack_598;
                      auVar69._0_8_ = local_5a0;
                      auVar85 = vfmadd132ps_fma(auVar155,auVar85,auVar69);
                      auVar143._4_4_ = fVar152;
                      auVar143._0_4_ = fVar152;
                      auVar143._8_4_ = fVar152;
                      auVar143._12_4_ = fVar152;
                      auVar85 = vfmadd213ps_fma(auVar143,auVar181._0_16_,auVar85);
                      local_330 = auVar85._0_4_;
                      local_320 = vshufps_avx(auVar85,auVar85,0x55);
                      local_310 = vshufps_avx(auVar85,auVar85,0xaa);
                      local_2e0 = local_390._0_8_;
                      uStack_2d8 = local_390._8_8_;
                      local_2d0 = local_500;
                      vpcmpeqd_avx2(ZEXT1632(local_500),ZEXT1632(local_500));
                      uStack_2bc = (local_570.context)->instID[0];
                      local_2c0 = uStack_2bc;
                      uStack_2b8 = uStack_2bc;
                      uStack_2b4 = uStack_2bc;
                      uStack_2b0 = (local_570.context)->instPrimID[0];
                      uStack_2ac = uStack_2b0;
                      uStack_2a8 = uStack_2b0;
                      uStack_2a4 = uStack_2b0;
                      local_5e0 = local_3a0;
                      local_570.valid = (int *)local_5e0;
                      local_570.geometryUserPtr = local_580->userPtr;
                      local_570.hit = (RTCHitN *)&local_330;
                      local_570.N = 4;
                      local_510._0_8_ = uVar74;
                      local_590._0_8_ = uVar80;
                      uVar75 = uVar80;
                      local_570.ray = (RTCRayN *)ray;
                      uStack_32c = local_330;
                      uStack_328 = local_330;
                      uStack_324 = local_330;
                      fStack_2fc = local_300;
                      fStack_2f8 = local_300;
                      fStack_2f4 = local_300;
                      uStack_2ec = local_2f0;
                      uStack_2e8 = local_2f0;
                      uStack_2e4 = local_2f0;
                      if (local_580->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        (*local_580->occlusionFilterN)(&local_570);
                        auVar181 = ZEXT1664(local_5c0);
                        uVar74 = local_510._0_8_;
                        uVar75 = local_590._0_8_;
                      }
                      uVar80 = vptestmd_avx512vl(local_5e0,local_5e0);
                      if ((uVar80 & 0xf) != 0) {
                        p_Var15 = context->args->filter;
                        if ((p_Var15 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((local_580->field_8).field_0x2 & 0x40) != 0)))) {
                          (*p_Var15)(&local_570);
                          auVar181 = ZEXT1664(local_5c0);
                          uVar74 = local_510._0_8_;
                          uVar75 = local_590._0_8_;
                        }
                        auVar85 = auVar186._0_16_;
                        auVar84 = *(undefined1 (*) [16])(local_570.ray + 0x80);
                        uVar80 = vptestmd_avx512vl(local_5e0,local_5e0);
                        uVar80 = uVar80 & 0xf;
                        auVar89 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                        bVar16 = (bool)((byte)uVar80 & 1);
                        auVar90._0_4_ = (uint)bVar16 * auVar89._0_4_ | (uint)!bVar16 * auVar84._0_4_
                        ;
                        bVar16 = (bool)((byte)(uVar80 >> 1) & 1);
                        auVar90._4_4_ = (uint)bVar16 * auVar89._4_4_ | (uint)!bVar16 * auVar84._4_4_
                        ;
                        bVar16 = (bool)((byte)(uVar80 >> 2) & 1);
                        auVar90._8_4_ = (uint)bVar16 * auVar89._8_4_ | (uint)!bVar16 * auVar84._8_4_
                        ;
                        bVar16 = SUB81(uVar80 >> 3,0);
                        auVar90._12_4_ =
                             (uint)bVar16 * auVar89._12_4_ | (uint)!bVar16 * auVar84._12_4_;
                        *(undefined1 (*) [16])(local_570.ray + 0x80) = auVar90;
                        if ((byte)uVar80 != 0) {
                          bVar72 = 1;
                          goto LAB_01a8b2c2;
                        }
                      }
                      *(undefined4 *)(ray + k * 4 + 0x80) = uVar139;
                      uVar80 = 0;
                      uVar74 = uVar74 ^ 1L << (uVar75 & 0x3f);
                      for (uVar75 = uVar74; (uVar75 & 1) == 0;
                          uVar75 = uVar75 >> 1 | 0x8000000000000000) {
                        uVar80 = uVar80 + 1;
                      }
                    }
                    bVar72 = 0;
LAB_01a8b2c2:
                    auVar97 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                    auVar193 = ZEXT3264(auVar97);
                    auVar85 = vxorps_avx512vl(auVar85,auVar85);
                    auVar186 = ZEXT1664(auVar85);
                    auVar187 = ZEXT3264(local_3c0);
                    auVar188 = ZEXT3264(local_3e0);
                    auVar189 = ZEXT3264(local_420);
                    auVar194 = ZEXT3264(local_400);
                    auVar185 = ZEXT3264(local_540);
                    auVar190 = ZEXT3264(local_4e0);
                    auVar191 = ZEXT3264(local_4a0);
                    auVar192 = ZEXT3264(local_4c0);
                  }
                  bVar76 = (bool)(bVar76 | bVar72);
                }
              }
              goto LAB_01a8b2a9;
            }
          }
          auVar185 = ZEXT3264(local_540);
        }
LAB_01a8b2a9:
      }
    }
    if (bVar76) break;
    uVar139 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar28._4_4_ = uVar139;
    auVar28._0_4_ = uVar139;
    auVar28._8_4_ = uVar139;
    auVar28._12_4_ = uVar139;
    auVar28._16_4_ = uVar139;
    auVar28._20_4_ = uVar139;
    auVar28._24_4_ = uVar139;
    auVar28._28_4_ = uVar139;
    uVar146 = vcmpps_avx512vl(local_80,auVar28,2);
    local_448 = (ulong)((uint)uVar77 & (uint)uVar146);
  }
  return local_448 != 0;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }